

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  byte bVar58;
  ulong uVar59;
  ulong uVar60;
  bool bVar61;
  Geometry *geometry;
  long lVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  float fVar66;
  float fVar67;
  float fVar115;
  float fVar117;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar75 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar76 [16];
  float fVar116;
  float fVar118;
  float fVar120;
  float fVar121;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar119;
  float fVar122;
  float fVar123;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined4 uVar124;
  float fVar130;
  float fVar131;
  vint4 bi_2;
  float fVar132;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  undefined8 uVar133;
  vint4 bi_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 ai_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar165;
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  uint uVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  RTCFilterFunctionNArguments local_8f0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  LinearSpace3fa *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  uint uStack_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  undefined1 local_700 [64];
  undefined8 local_6a0;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined4 local_600;
  int local_5fc;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  float local_5a0 [4];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar179 [64];
  
  PVar8 = prim[1];
  uVar60 = (ulong)(byte)PVar8;
  fVar142 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar72 = vsubps_avx(auVar72,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar143._0_4_ = fVar142 * auVar72._0_4_;
  auVar143._4_4_ = fVar142 * auVar72._4_4_;
  auVar143._8_4_ = fVar142 * auVar72._8_4_;
  auVar143._12_4_ = fVar142 * auVar72._12_4_;
  auVar75._0_4_ = fVar142 * auVar70._0_4_;
  auVar75._4_4_ = fVar142 * auVar70._4_4_;
  auVar75._8_4_ = fVar142 * auVar70._8_4_;
  auVar75._12_4_ = fVar142 * auVar70._12_4_;
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar60 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar64 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + uVar60 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  uVar59 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar175._4_4_ = auVar75._0_4_;
  auVar175._0_4_ = auVar75._0_4_;
  auVar175._8_4_ = auVar75._0_4_;
  auVar175._12_4_ = auVar75._0_4_;
  auVar73 = vshufps_avx(auVar75,auVar75,0x55);
  auVar71 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar142 = auVar71._0_4_;
  auVar76._0_4_ = fVar142 * auVar74._0_4_;
  fVar130 = auVar71._4_4_;
  auVar76._4_4_ = fVar130 * auVar74._4_4_;
  fVar131 = auVar71._8_4_;
  auVar76._8_4_ = fVar131 * auVar74._8_4_;
  fVar132 = auVar71._12_4_;
  auVar76._12_4_ = fVar132 * auVar74._12_4_;
  auVar134._0_4_ = auVar19._0_4_ * fVar142;
  auVar134._4_4_ = auVar19._4_4_ * fVar130;
  auVar134._8_4_ = auVar19._8_4_ * fVar131;
  auVar134._12_4_ = auVar19._12_4_ * fVar132;
  auVar125._0_4_ = auVar21._0_4_ * fVar142;
  auVar125._4_4_ = auVar21._4_4_ * fVar130;
  auVar125._8_4_ = auVar21._8_4_ * fVar131;
  auVar125._12_4_ = auVar21._12_4_ * fVar132;
  auVar71 = vfmadd231ps_fma(auVar76,auVar73,auVar70);
  auVar69 = vfmadd231ps_fma(auVar134,auVar73,auVar18);
  auVar73 = vfmadd231ps_fma(auVar125,auVar136,auVar73);
  auVar68 = vfmadd231ps_fma(auVar71,auVar175,auVar72);
  auVar69 = vfmadd231ps_fma(auVar69,auVar175,auVar137);
  auVar75 = vfmadd231ps_fma(auVar73,auVar20,auVar175);
  auVar176._4_4_ = auVar143._0_4_;
  auVar176._0_4_ = auVar143._0_4_;
  auVar176._8_4_ = auVar143._0_4_;
  auVar176._12_4_ = auVar143._0_4_;
  auVar73 = vshufps_avx(auVar143,auVar143,0x55);
  auVar71 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar142 = auVar71._0_4_;
  auVar180._0_4_ = fVar142 * auVar74._0_4_;
  fVar130 = auVar71._4_4_;
  auVar180._4_4_ = fVar130 * auVar74._4_4_;
  fVar131 = auVar71._8_4_;
  auVar180._8_4_ = fVar131 * auVar74._8_4_;
  fVar132 = auVar71._12_4_;
  auVar180._12_4_ = fVar132 * auVar74._12_4_;
  auVar152._0_4_ = auVar19._0_4_ * fVar142;
  auVar152._4_4_ = auVar19._4_4_ * fVar130;
  auVar152._8_4_ = auVar19._8_4_ * fVar131;
  auVar152._12_4_ = auVar19._12_4_ * fVar132;
  auVar144._0_4_ = auVar21._0_4_ * fVar142;
  auVar144._4_4_ = auVar21._4_4_ * fVar130;
  auVar144._8_4_ = auVar21._8_4_ * fVar131;
  auVar144._12_4_ = auVar21._12_4_ * fVar132;
  auVar70 = vfmadd231ps_fma(auVar180,auVar73,auVar70);
  auVar74 = vfmadd231ps_fma(auVar152,auVar73,auVar18);
  auVar18 = vfmadd231ps_fma(auVar144,auVar73,auVar136);
  auVar19 = vfmadd231ps_fma(auVar70,auVar176,auVar72);
  auVar136 = vfmadd231ps_fma(auVar74,auVar176,auVar137);
  auVar166._8_4_ = 0x7fffffff;
  auVar166._0_8_ = 0x7fffffff7fffffff;
  auVar166._12_4_ = 0x7fffffff;
  auVar21 = vfmadd231ps_fma(auVar18,auVar176,auVar20);
  auVar72 = vandps_avx(auVar68,auVar166);
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar72,auVar162,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar71._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar68._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar68._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar68._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar68._12_4_;
  auVar72 = vandps_avx(auVar69,auVar166);
  uVar64 = vcmpps_avx512vl(auVar72,auVar162,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar68._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._12_4_;
  auVar72 = vandps_avx(auVar75,auVar166);
  uVar64 = vcmpps_avx512vl(auVar72,auVar162,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar69._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._12_4_;
  auVar70 = vrcp14ps_avx512vl(auVar71);
  auVar163._8_4_ = 0x3f800000;
  auVar163._0_8_ = 0x3f8000003f800000;
  auVar163._12_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar71,auVar70,auVar163);
  auVar137 = vfmadd132ps_fma(auVar72,auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar72 = vfnmadd213ps_fma(auVar68,auVar70,auVar163);
  auVar18 = vfmadd132ps_fma(auVar72,auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar69);
  auVar72 = vfnmadd213ps_fma(auVar69,auVar70,auVar163);
  auVar20 = vfmadd132ps_fma(auVar72,auVar70,auVar70);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar72 = vpmovsxwd_avx(auVar72);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar19);
  auVar158._0_4_ = auVar137._0_4_ * auVar72._0_4_;
  auVar158._4_4_ = auVar137._4_4_ * auVar72._4_4_;
  auVar158._8_4_ = auVar137._8_4_ * auVar72._8_4_;
  auVar158._12_4_ = auVar137._12_4_ * auVar72._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar72 = vpmovsxwd_avx(auVar70);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar19);
  auVar71 = vpbroadcastd_avx512vl();
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar70 = vpmovsxwd_avx(auVar74);
  auVar139._0_4_ = auVar137._0_4_ * auVar72._0_4_;
  auVar139._4_4_ = auVar137._4_4_ * auVar72._4_4_;
  auVar139._8_4_ = auVar137._8_4_ * auVar72._8_4_;
  auVar139._12_4_ = auVar137._12_4_ * auVar72._12_4_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar60 * -2 + 6);
  auVar72 = vpmovsxwd_avx(auVar137);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar136);
  auVar164._0_4_ = auVar18._0_4_ * auVar72._0_4_;
  auVar164._4_4_ = auVar18._4_4_ * auVar72._4_4_;
  auVar164._8_4_ = auVar18._8_4_ * auVar72._8_4_;
  auVar164._12_4_ = auVar18._12_4_ * auVar72._12_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,auVar136);
  auVar135._0_4_ = auVar18._0_4_ * auVar72._0_4_;
  auVar135._4_4_ = auVar18._4_4_ * auVar72._4_4_;
  auVar135._8_4_ = auVar18._8_4_ * auVar72._8_4_;
  auVar135._12_4_ = auVar18._12_4_ * auVar72._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar59 + uVar60 + 6);
  auVar72 = vpmovsxwd_avx(auVar18);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar21);
  auVar153._0_4_ = auVar20._0_4_ * auVar72._0_4_;
  auVar153._4_4_ = auVar20._4_4_ * auVar72._4_4_;
  auVar153._8_4_ = auVar20._8_4_ * auVar72._8_4_;
  auVar153._12_4_ = auVar20._12_4_ * auVar72._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar72 = vpmovsxwd_avx(auVar19);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar21);
  auVar126._0_4_ = auVar20._0_4_ * auVar72._0_4_;
  auVar126._4_4_ = auVar20._4_4_ * auVar72._4_4_;
  auVar126._8_4_ = auVar20._8_4_ * auVar72._8_4_;
  auVar126._12_4_ = auVar20._12_4_ * auVar72._12_4_;
  auVar72 = vpminsd_avx(auVar158,auVar139);
  auVar70 = vpminsd_avx(auVar164,auVar135);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx(auVar153,auVar126);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar20._4_4_ = uVar124;
  auVar20._0_4_ = uVar124;
  auVar20._8_4_ = uVar124;
  auVar20._12_4_ = uVar124;
  auVar70 = vmaxps_avx512vl(auVar70,auVar20);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar136._8_4_ = 0x3f7ffffa;
  auVar136._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar136._12_4_ = 0x3f7ffffa;
  local_670 = vmulps_avx512vl(auVar72,auVar136);
  auVar72 = vpmaxsd_avx(auVar158,auVar139);
  auVar70 = vpmaxsd_avx(auVar164,auVar135);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx(auVar153,auVar126);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar21._4_4_ = uVar124;
  auVar21._0_4_ = uVar124;
  auVar21._8_4_ = uVar124;
  auVar21._12_4_ = uVar124;
  auVar70 = vminps_avx512vl(auVar70,auVar21);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar73._8_4_ = 0x3f800003;
  auVar73._0_8_ = 0x3f8000033f800003;
  auVar73._12_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar73);
  uVar22 = vcmpps_avx512vl(local_670,auVar72,2);
  uVar64 = vpcmpgtd_avx512vl(auVar71,_DAT_01f7fcf0);
  uVar64 = ((byte)uVar22 & 0xf) & uVar64;
  if ((char)uVar64 == '\0') {
    bVar61 = false;
  }
  else {
    local_7e8 = pre->ray_space + k;
    auVar129 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar129);
    do {
      auVar129 = local_480;
      lVar24 = 0;
      for (uVar59 = uVar64; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar63 = *(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[uVar63].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(prim + lVar24 * 4 + 6));
      uVar59 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar24 * 4 + 6)));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar10[1].time_range.upper;
      auVar72 = *(undefined1 (*) [16])(lVar24 + (long)p_Var11 * uVar59);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar59 + 1) * (long)p_Var11);
      uVar22 = *(undefined8 *)*pauVar3;
      uVar53 = *(undefined8 *)(*pauVar3 + 8);
      auVar20 = *pauVar3;
      auVar18 = *pauVar3;
      auVar70 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar59 + 2) * (long)p_Var11);
      uVar54 = *(undefined8 *)*pauVar4;
      uVar55 = *(undefined8 *)(*pauVar4 + 8);
      auVar19 = *pauVar4;
      auVar137 = *pauVar4;
      auVar74 = *pauVar4;
      uVar64 = uVar64 - 1 & uVar64;
      pauVar5 = (undefined1 (*) [12])(lVar24 + (uVar59 + 3) * (long)p_Var11);
      local_800 = (float)*(undefined8 *)*pauVar5;
      fStack_7fc = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_7f8 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_7f4 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar64 != 0) {
        uVar60 = uVar64 - 1 & uVar64;
        for (uVar59 = uVar64; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        }
        if (uVar60 != 0) {
          for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar136 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar136 = vinsertps_avx(auVar136,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar73 = vsubps_avx(auVar72,auVar136);
      uVar124 = auVar73._0_4_;
      auVar140._4_4_ = uVar124;
      auVar140._0_4_ = uVar124;
      auVar140._8_4_ = uVar124;
      auVar140._12_4_ = uVar124;
      auVar21 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      aVar6 = (local_7e8->vx).field_0;
      aVar7 = (local_7e8->vy).field_0;
      fVar142 = (local_7e8->vz).field_0.m128[0];
      fVar130 = *(float *)((long)&(local_7e8->vz).field_0 + 4);
      fVar131 = *(float *)((long)&(local_7e8->vz).field_0 + 8);
      fVar132 = *(float *)((long)&(local_7e8->vz).field_0 + 0xc);
      auVar169._0_4_ = fVar142 * auVar73._0_4_;
      auVar169._4_4_ = fVar130 * auVar73._4_4_;
      auVar169._8_4_ = fVar131 * auVar73._8_4_;
      auVar169._12_4_ = fVar132 * auVar73._12_4_;
      auVar21 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar7,auVar21);
      auVar69 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar140);
      auVar21 = vshufps_avx(auVar72,auVar72,0xff);
      auVar71 = vsubps_avx(auVar70,auVar136);
      uVar124 = auVar71._0_4_;
      auVar145._4_4_ = uVar124;
      auVar145._0_4_ = uVar124;
      auVar145._8_4_ = uVar124;
      auVar145._12_4_ = uVar124;
      auVar73 = vshufps_avx(auVar71,auVar71,0x55);
      auVar71 = vshufps_avx(auVar71,auVar71,0xaa);
      auVar170._0_4_ = fVar142 * auVar71._0_4_;
      auVar170._4_4_ = fVar130 * auVar71._4_4_;
      auVar170._8_4_ = fVar131 * auVar71._8_4_;
      auVar170._12_4_ = fVar132 * auVar71._12_4_;
      auVar73 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar7,auVar73);
      auVar68 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar6,auVar145);
      auVar70 = vshufps_avx(auVar70,auVar70,0xff);
      auVar71 = vsubps_avx(auVar74,auVar136);
      uVar124 = auVar71._0_4_;
      auVar167._4_4_ = uVar124;
      auVar167._0_4_ = uVar124;
      auVar167._8_4_ = uVar124;
      auVar167._12_4_ = uVar124;
      auVar73 = vshufps_avx(auVar71,auVar71,0x55);
      auVar71 = vshufps_avx(auVar71,auVar71,0xaa);
      auVar173._0_4_ = fVar142 * auVar71._0_4_;
      auVar173._4_4_ = fVar130 * auVar71._4_4_;
      auVar173._8_4_ = fVar131 * auVar71._8_4_;
      auVar173._12_4_ = fVar132 * auVar71._12_4_;
      auVar73 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar73);
      auVar71 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar6,auVar167);
      auVar74 = vshufps_avx(auVar74,auVar74,0xff);
      auVar56._12_4_ = fStack_7f4;
      auVar56._0_12_ = *pauVar5;
      auVar73 = vsubps_avx512vl(auVar56,auVar136);
      uVar124 = auVar73._0_4_;
      auVar146._4_4_ = uVar124;
      auVar146._0_4_ = uVar124;
      auVar146._8_4_ = uVar124;
      auVar146._12_4_ = uVar124;
      auVar136 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar174._0_4_ = fVar142 * auVar73._0_4_;
      auVar174._4_4_ = fVar130 * auVar73._4_4_;
      auVar174._8_4_ = fVar131 * auVar73._8_4_;
      auVar174._12_4_ = fVar132 * auVar73._12_4_;
      auVar136 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar7,auVar136);
      auVar136 = vfmadd231ps_fma(auVar136,(undefined1  [16])aVar6,auVar146);
      lVar24 = (long)iVar9 * 0x44;
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      auVar73 = vshufps_avx512vl(auVar56,auVar56,0xff);
      local_780 = vbroadcastss_avx512vl(auVar69);
      auVar77._8_4_ = 1;
      auVar77._0_8_ = 0x100000001;
      auVar77._12_4_ = 1;
      auVar77._16_4_ = 1;
      auVar77._20_4_ = 1;
      auVar77._24_4_ = 1;
      auVar77._28_4_ = 1;
      local_760 = vpermps_avx512vl(auVar77,ZEXT1632(auVar69));
      uVar133 = auVar21._0_8_;
      local_320._8_8_ = uVar133;
      local_320._0_8_ = uVar133;
      local_320._16_8_ = uVar133;
      local_320._24_8_ = uVar133;
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar124 = auVar68._0_4_;
      local_8c0._4_4_ = uVar124;
      local_8c0._0_4_ = uVar124;
      local_8c0._8_4_ = uVar124;
      local_8c0._12_4_ = uVar124;
      local_8c0._16_4_ = uVar124;
      local_8c0._20_4_ = uVar124;
      local_8c0._24_4_ = uVar124;
      local_8c0._28_4_ = uVar124;
      local_8a0 = vpermps_avx512vl(auVar77,ZEXT1632(auVar68));
      uVar133 = auVar70._0_8_;
      local_340._8_8_ = uVar133;
      local_340._0_8_ = uVar133;
      local_340._16_8_ = uVar133;
      local_340._24_8_ = uVar133;
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_840 = vbroadcastss_avx512vl(auVar71);
      local_7a0 = vpermps_avx2(auVar77,ZEXT1632(auVar71));
      local_360 = vbroadcastsd_avx512vl(auVar74);
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_860 = vbroadcastss_avx512vl(auVar136);
      auVar190 = ZEXT3264(local_860);
      local_880 = vpermps_avx512vl(auVar77,ZEXT1632(auVar136));
      auVar191 = ZEXT3264(local_880);
      _local_380 = vbroadcastsd_avx512vl(auVar73);
      auVar77 = vmulps_avx512vl(local_860,auVar91);
      auVar78 = vmulps_avx512vl(local_880,auVar91);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar92,local_840);
      auVar70 = vfmadd231ps_fma(auVar78,auVar92,local_7a0);
      auVar74 = vfmadd231ps_fma(auVar77,auVar94,local_8c0);
      auVar79 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar94,local_8a0);
      auVar80 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar93,local_780);
      auVar77 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar78 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar81 = vfmadd231ps_avx512vl(auVar79,auVar93,local_760);
      auVar79 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar82 = vmulps_avx512vl(local_860,auVar90);
      auVar83 = vmulps_avx512vl(local_880,auVar90);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar79,local_840);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,local_7a0);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar78,local_8c0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar78,local_8a0);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar77,local_780);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar77,local_760);
      auVar84 = vsubps_avx512vl(auVar82,auVar80);
      auVar85 = vsubps_avx512vl(auVar83,auVar81);
      auVar86 = vmulps_avx512vl(auVar81,auVar84);
      auVar87 = vmulps_avx512vl(auVar80,auVar85);
      auVar86 = vsubps_avx512vl(auVar86,auVar87);
      auVar87 = vmulps_avx512vl(_local_380,auVar91);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_360);
      auVar70 = vfmadd231ps_fma(auVar87,auVar94,local_340);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar93,local_320);
      auVar88 = vmulps_avx512vl(_local_380,auVar90);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar79,local_360);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar78,local_340);
      auVar21 = vfmadd231ps_fma(auVar88,auVar77,local_320);
      auVar88 = vmulps_avx512vl(auVar85,auVar85);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,auVar84);
      auVar89 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar21));
      auVar89 = vmulps_avx512vl(auVar89,auVar89);
      auVar88 = vmulps_avx512vl(auVar89,auVar88);
      auVar86 = vmulps_avx512vl(auVar86,auVar86);
      uVar133 = vcmpps_avx512vl(auVar86,auVar88,2);
      auVar70 = vblendps_avx(auVar69,auVar72,8);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar74 = vandps_avx512vl(auVar70,auVar73);
      auVar70 = vblendps_avx(auVar68,*pauVar3,8);
      auVar70 = vandps_avx512vl(auVar70,auVar73);
      auVar74 = vmaxps_avx(auVar74,auVar70);
      auVar70 = vblendps_avx(auVar71,*pauVar4,8);
      auVar75 = vandps_avx512vl(auVar70,auVar73);
      auVar70 = vblendps_avx(auVar136,auVar56,8);
      auVar70 = vandps_avx512vl(auVar70,auVar73);
      auVar70 = vmaxps_avx(auVar75,auVar70);
      auVar70 = vmaxps_avx(auVar74,auVar70);
      auVar74 = vmovshdup_avx(auVar70);
      auVar74 = vmaxss_avx(auVar74,auVar70);
      auVar70 = vshufpd_avx(auVar70,auVar70,1);
      auVar70 = vmaxss_avx(auVar70,auVar74);
      auVar88._0_4_ = (float)iVar9;
      local_480._4_12_ = auVar69._4_12_;
      local_480._0_4_ = auVar88._0_4_;
      local_480._16_48_ = auVar129._16_48_;
      auVar88._4_4_ = auVar88._0_4_;
      auVar88._8_4_ = auVar88._0_4_;
      auVar88._12_4_ = auVar88._0_4_;
      auVar88._16_4_ = auVar88._0_4_;
      auVar88._20_4_ = auVar88._0_4_;
      auVar88._24_4_ = auVar88._0_4_;
      auVar88._28_4_ = auVar88._0_4_;
      uVar23 = vcmpps_avx512vl(auVar88,_DAT_01faff40,0xe);
      bVar65 = (byte)uVar133 & (byte)uVar23;
      auVar70 = vmulss_avx512f(auVar70,ZEXT416(0x35000000));
      auVar86._8_4_ = 2;
      auVar86._0_8_ = 0x200000002;
      auVar86._12_4_ = 2;
      auVar86._16_4_ = 2;
      auVar86._20_4_ = 2;
      auVar86._24_4_ = 2;
      auVar86._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar69));
      local_3c0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar68));
      local_3e0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar71));
      local_820 = vpermps_avx2(auVar86,ZEXT1632(auVar136));
      uVar172 = *(uint *)(ray + k * 4 + 0xc0);
      auVar74 = local_3a0._0_16_;
      if (bVar65 == 0) {
        bVar61 = false;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar184 = ZEXT3264(auVar93);
        auVar74 = vxorps_avx512vl(auVar74,auVar74);
        auVar185 = ZEXT1664(auVar74);
        auVar186 = ZEXT3264(local_780);
        auVar187 = ZEXT3264(local_760);
        auVar183 = ZEXT3264(local_8c0);
        auVar129 = ZEXT3264(local_8a0);
        auVar188 = ZEXT3264(local_840);
        auVar189 = ZEXT3264(local_7a0);
      }
      else {
        local_7c0._0_16_ = ZEXT416(uVar172);
        local_740._0_16_ = auVar70;
        auVar90 = vmulps_avx512vl(local_820,auVar90);
        auVar79 = vfmadd213ps_avx512vl(auVar79,local_3e0,auVar90);
        auVar78 = vfmadd213ps_avx512vl(auVar78,local_3c0,auVar79);
        auVar90 = vfmadd213ps_avx512vl(auVar77,local_3a0,auVar78);
        auVar91 = vmulps_avx512vl(local_820,auVar91);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_3e0,auVar91);
        auVar78 = vfmadd213ps_avx512vl(auVar94,local_3c0,auVar92);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar77 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar86 = vfmadd213ps_avx512vl(auVar93,local_3a0,auVar78);
        auVar93 = vmulps_avx512vl(local_860,auVar77);
        auVar78 = vmulps_avx512vl(local_880,auVar77);
        auVar77 = vmulps_avx512vl(local_820,auVar77);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_840);
        auVar136 = vfmadd231ps_fma(auVar78,auVar91,local_7a0);
        auVar91 = vfmadd231ps_avx512vl(auVar77,local_3e0,auVar91);
        auVar73 = vfmadd231ps_fma(auVar93,auVar92,local_8c0);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar136),auVar92,local_8a0);
        auVar77 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar92);
        auVar78 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar94,local_780);
        auVar79 = vfmadd231ps_avx512vl(auVar93,auVar94,local_760);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar77 = vfmadd231ps_avx512vl(auVar77,local_3a0,auVar94);
        auVar94 = vmulps_avx512vl(local_860,auVar91);
        auVar89 = vmulps_avx512vl(local_880,auVar91);
        auVar91 = vmulps_avx512vl(local_820,auVar91);
        auVar192 = ZEXT1664(auVar70);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar92,local_840);
        auVar136 = vfmadd231ps_fma(auVar89,auVar92,local_7a0);
        auVar189 = ZEXT3264(local_7a0);
        auVar92 = vfmadd231ps_avx512vl(auVar91,local_3e0,auVar92);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar91 = vfmadd231ps_avx512vl(auVar95,auVar94,local_8c0);
        auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar136),auVar94,local_8a0);
        auVar94 = vfmadd231ps_avx512vl(auVar92,local_3c0,auVar94);
        auVar92 = vfmadd231ps_avx512vl(auVar91,auVar93,local_780);
        auVar91 = vfmadd231ps_avx512vl(auVar89,auVar93,local_760);
        auVar89 = vfmadd231ps_avx512vl(auVar94,local_3a0,auVar93);
        auVar181._8_4_ = 0x7fffffff;
        auVar181._0_8_ = 0x7fffffff7fffffff;
        auVar181._12_4_ = 0x7fffffff;
        auVar181._16_4_ = 0x7fffffff;
        auVar181._20_4_ = 0x7fffffff;
        auVar181._24_4_ = 0x7fffffff;
        auVar181._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar78,auVar181);
        auVar94 = vandps_avx(auVar79,auVar181);
        auVar94 = vmaxps_avx(auVar93,auVar94);
        auVar93 = vandps_avx(auVar77,auVar181);
        auVar93 = vmaxps_avx(auVar94,auVar93);
        auVar77 = vbroadcastss_avx512vl(auVar70);
        uVar59 = vcmpps_avx512vl(auVar93,auVar77,1);
        bVar61 = (bool)((byte)uVar59 & 1);
        auVar95._0_4_ = (float)((uint)bVar61 * auVar84._0_4_ | (uint)!bVar61 * auVar78._0_4_);
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar61 * auVar84._4_4_ | (uint)!bVar61 * auVar78._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar61 * auVar84._8_4_ | (uint)!bVar61 * auVar78._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar61 * auVar84._12_4_ | (uint)!bVar61 * auVar78._12_4_);
        bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar95._16_4_ = (float)((uint)bVar61 * auVar84._16_4_ | (uint)!bVar61 * auVar78._16_4_);
        bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar95._20_4_ = (float)((uint)bVar61 * auVar84._20_4_ | (uint)!bVar61 * auVar78._20_4_);
        bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar95._24_4_ = (float)((uint)bVar61 * auVar84._24_4_ | (uint)!bVar61 * auVar78._24_4_);
        bVar61 = SUB81(uVar59 >> 7,0);
        auVar95._28_4_ = (uint)bVar61 * auVar84._28_4_ | (uint)!bVar61 * auVar78._28_4_;
        bVar61 = (bool)((byte)uVar59 & 1);
        auVar96._0_4_ = (float)((uint)bVar61 * auVar85._0_4_ | (uint)!bVar61 * auVar79._0_4_);
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar79._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar79._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar79._12_4_);
        bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar61 * auVar85._16_4_ | (uint)!bVar61 * auVar79._16_4_);
        bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar61 * auVar85._20_4_ | (uint)!bVar61 * auVar79._20_4_);
        bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar61 * auVar85._24_4_ | (uint)!bVar61 * auVar79._24_4_);
        bVar61 = SUB81(uVar59 >> 7,0);
        auVar96._28_4_ = (uint)bVar61 * auVar85._28_4_ | (uint)!bVar61 * auVar79._28_4_;
        auVar93 = vandps_avx(auVar181,auVar92);
        auVar94 = vandps_avx(auVar91,auVar181);
        auVar94 = vmaxps_avx(auVar93,auVar94);
        auVar93 = vandps_avx(auVar89,auVar181);
        auVar93 = vmaxps_avx(auVar94,auVar93);
        uVar59 = vcmpps_avx512vl(auVar93,auVar77,1);
        bVar61 = (bool)((byte)uVar59 & 1);
        auVar89._0_4_ = (float)((uint)bVar61 * auVar84._0_4_ | (uint)!bVar61 * auVar92._0_4_);
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar89._4_4_ = (float)((uint)bVar61 * auVar84._4_4_ | (uint)!bVar61 * auVar92._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar89._8_4_ = (float)((uint)bVar61 * auVar84._8_4_ | (uint)!bVar61 * auVar92._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar89._12_4_ = (float)((uint)bVar61 * auVar84._12_4_ | (uint)!bVar61 * auVar92._12_4_);
        bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar89._16_4_ = (float)((uint)bVar61 * auVar84._16_4_ | (uint)!bVar61 * auVar92._16_4_);
        bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar89._20_4_ = (float)((uint)bVar61 * auVar84._20_4_ | (uint)!bVar61 * auVar92._20_4_);
        bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar89._24_4_ = (float)((uint)bVar61 * auVar84._24_4_ | (uint)!bVar61 * auVar92._24_4_);
        bVar61 = SUB81(uVar59 >> 7,0);
        auVar89._28_4_ = (uint)bVar61 * auVar84._28_4_ | (uint)!bVar61 * auVar92._28_4_;
        bVar61 = (bool)((byte)uVar59 & 1);
        auVar84._0_4_ = (float)((uint)bVar61 * auVar85._0_4_ | (uint)!bVar61 * auVar91._0_4_);
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar84._4_4_ = (float)((uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar91._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar84._8_4_ = (float)((uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar91._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar84._12_4_ = (float)((uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar91._12_4_);
        bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar84._16_4_ = (float)((uint)bVar61 * auVar85._16_4_ | (uint)!bVar61 * auVar91._16_4_);
        bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar84._20_4_ = (float)((uint)bVar61 * auVar85._20_4_ | (uint)!bVar61 * auVar91._20_4_);
        bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar84._24_4_ = (float)((uint)bVar61 * auVar85._24_4_ | (uint)!bVar61 * auVar91._24_4_);
        bVar61 = SUB81(uVar59 >> 7,0);
        auVar84._28_4_ = (uint)bVar61 * auVar85._28_4_ | (uint)!bVar61 * auVar91._28_4_;
        auVar76 = vxorps_avx512vl(auVar74,auVar74);
        auVar185 = ZEXT1664(auVar76);
        auVar93 = vfmadd213ps_avx512vl(auVar95,auVar95,ZEXT1632(auVar76));
        auVar74 = vfmadd231ps_fma(auVar93,auVar96,auVar96);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
        fVar142 = auVar92._0_4_;
        fVar130 = auVar92._4_4_;
        fVar131 = auVar92._8_4_;
        fVar132 = auVar92._12_4_;
        fVar161 = auVar92._16_4_;
        fVar165 = auVar92._20_4_;
        fVar66 = auVar92._24_4_;
        auVar93._4_4_ = fVar130 * fVar130 * fVar130 * auVar74._4_4_ * -0.5;
        auVar93._0_4_ = fVar142 * fVar142 * fVar142 * auVar74._0_4_ * -0.5;
        auVar93._8_4_ = fVar131 * fVar131 * fVar131 * auVar74._8_4_ * -0.5;
        auVar93._12_4_ = fVar132 * fVar132 * fVar132 * auVar74._12_4_ * -0.5;
        auVar93._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar93._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar93._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
        auVar93._28_4_ = 0;
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar77,auVar92);
        auVar94._4_4_ = auVar96._4_4_ * auVar93._4_4_;
        auVar94._0_4_ = auVar96._0_4_ * auVar93._0_4_;
        auVar94._8_4_ = auVar96._8_4_ * auVar93._8_4_;
        auVar94._12_4_ = auVar96._12_4_ * auVar93._12_4_;
        auVar94._16_4_ = auVar96._16_4_ * auVar93._16_4_;
        auVar94._20_4_ = auVar96._20_4_ * auVar93._20_4_;
        auVar94._24_4_ = auVar96._24_4_ * auVar93._24_4_;
        auVar94._28_4_ = auVar92._28_4_;
        auVar92._4_4_ = auVar93._4_4_ * -auVar95._4_4_;
        auVar92._0_4_ = auVar93._0_4_ * -auVar95._0_4_;
        auVar92._8_4_ = auVar93._8_4_ * -auVar95._8_4_;
        auVar92._12_4_ = auVar93._12_4_ * -auVar95._12_4_;
        auVar92._16_4_ = auVar93._16_4_ * -auVar95._16_4_;
        auVar92._20_4_ = auVar93._20_4_ * -auVar95._20_4_;
        auVar92._24_4_ = auVar93._24_4_ * -auVar95._24_4_;
        auVar92._28_4_ = auVar95._28_4_ ^ 0x80000000;
        auVar85 = vmulps_avx512vl(auVar93,ZEXT1632(auVar76));
        auVar95 = ZEXT1632(auVar76);
        auVar91 = vfmadd213ps_avx512vl(auVar89,auVar89,auVar95);
        auVar74 = vfmadd231ps_fma(auVar91,auVar84,auVar84);
        auVar79 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
        fVar142 = auVar79._0_4_;
        fVar130 = auVar79._4_4_;
        fVar131 = auVar79._8_4_;
        fVar132 = auVar79._12_4_;
        fVar161 = auVar79._16_4_;
        fVar165 = auVar79._20_4_;
        fVar66 = auVar79._24_4_;
        auVar91._4_4_ = fVar130 * fVar130 * fVar130 * auVar74._4_4_ * -0.5;
        auVar91._0_4_ = fVar142 * fVar142 * fVar142 * auVar74._0_4_ * -0.5;
        auVar91._8_4_ = fVar131 * fVar131 * fVar131 * auVar74._8_4_ * -0.5;
        auVar91._12_4_ = fVar132 * fVar132 * fVar132 * auVar74._12_4_ * -0.5;
        auVar91._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar91._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar91._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
        auVar91._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar77,auVar79);
        auVar78._4_4_ = auVar84._4_4_ * auVar91._4_4_;
        auVar78._0_4_ = auVar84._0_4_ * auVar91._0_4_;
        auVar78._8_4_ = auVar84._8_4_ * auVar91._8_4_;
        auVar78._12_4_ = auVar84._12_4_ * auVar91._12_4_;
        auVar78._16_4_ = auVar84._16_4_ * auVar91._16_4_;
        auVar78._20_4_ = auVar84._20_4_ * auVar91._20_4_;
        auVar78._24_4_ = auVar84._24_4_ * auVar91._24_4_;
        auVar78._28_4_ = auVar79._28_4_;
        auVar79._4_4_ = -auVar89._4_4_ * auVar91._4_4_;
        auVar79._0_4_ = -auVar89._0_4_ * auVar91._0_4_;
        auVar79._8_4_ = -auVar89._8_4_ * auVar91._8_4_;
        auVar79._12_4_ = -auVar89._12_4_ * auVar91._12_4_;
        auVar79._16_4_ = -auVar89._16_4_ * auVar91._16_4_;
        auVar79._20_4_ = -auVar89._20_4_ * auVar91._20_4_;
        auVar79._24_4_ = -auVar89._24_4_ * auVar91._24_4_;
        auVar79._28_4_ = auVar93._28_4_;
        auVar93 = vmulps_avx512vl(auVar91,auVar95);
        auVar74 = vfmadd213ps_fma(auVar94,auVar87,auVar80);
        auVar136 = vfmadd213ps_fma(auVar92,auVar87,auVar81);
        auVar91 = vfmadd213ps_avx512vl(auVar85,auVar87,auVar86);
        auVar77 = vfmadd213ps_avx512vl(auVar78,ZEXT1632(auVar21),auVar82);
        auVar75 = vfnmadd213ps_fma(auVar94,auVar87,auVar80);
        auVar80 = ZEXT1632(auVar21);
        auVar73 = vfmadd213ps_fma(auVar79,auVar80,auVar83);
        auVar125 = vfnmadd213ps_fma(auVar92,auVar87,auVar81);
        auVar71 = vfmadd213ps_fma(auVar93,auVar80,auVar90);
        auVar94 = vfnmadd231ps_avx512vl(auVar86,auVar87,auVar85);
        auVar126 = vfnmadd213ps_fma(auVar78,auVar80,auVar82);
        auVar134 = vfnmadd213ps_fma(auVar79,auVar80,auVar83);
        auVar135 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar21),auVar93);
        auVar92 = vsubps_avx512vl(auVar77,ZEXT1632(auVar75));
        auVar93 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar125));
        auVar78 = vsubps_avx512vl(ZEXT1632(auVar71),auVar94);
        auVar79 = vmulps_avx512vl(auVar93,auVar94);
        auVar69 = vfmsub231ps_fma(auVar79,ZEXT1632(auVar125),auVar78);
        auVar90._4_4_ = auVar75._4_4_ * auVar78._4_4_;
        auVar90._0_4_ = auVar75._0_4_ * auVar78._0_4_;
        auVar90._8_4_ = auVar75._8_4_ * auVar78._8_4_;
        auVar90._12_4_ = auVar75._12_4_ * auVar78._12_4_;
        auVar90._16_4_ = auVar78._16_4_ * 0.0;
        auVar90._20_4_ = auVar78._20_4_ * 0.0;
        auVar90._24_4_ = auVar78._24_4_ * 0.0;
        auVar90._28_4_ = auVar78._28_4_;
        auVar78 = vfmsub231ps_avx512vl(auVar90,auVar94,auVar92);
        auVar80._4_4_ = auVar125._4_4_ * auVar92._4_4_;
        auVar80._0_4_ = auVar125._0_4_ * auVar92._0_4_;
        auVar80._8_4_ = auVar125._8_4_ * auVar92._8_4_;
        auVar80._12_4_ = auVar125._12_4_ * auVar92._12_4_;
        auVar80._16_4_ = auVar92._16_4_ * 0.0;
        auVar80._20_4_ = auVar92._20_4_ * 0.0;
        auVar80._24_4_ = auVar92._24_4_ * 0.0;
        auVar80._28_4_ = auVar92._28_4_;
        auVar68 = vfmsub231ps_fma(auVar80,ZEXT1632(auVar75),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar95,auVar78);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,ZEXT1632(auVar69));
        auVar84 = ZEXT1632(auVar76);
        uVar59 = vcmpps_avx512vl(auVar93,auVar84,2);
        bVar58 = (byte)uVar59;
        fVar66 = (float)((uint)(bVar58 & 1) * auVar74._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar126._0_4_);
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        fVar115 = (float)((uint)bVar61 * auVar74._4_4_ | (uint)!bVar61 * auVar126._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        fVar117 = (float)((uint)bVar61 * auVar74._8_4_ | (uint)!bVar61 * auVar126._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        fVar120 = (float)((uint)bVar61 * auVar74._12_4_ | (uint)!bVar61 * auVar126._12_4_);
        auVar79 = ZEXT1632(CONCAT412(fVar120,CONCAT48(fVar117,CONCAT44(fVar115,fVar66))));
        fVar67 = (float)((uint)(bVar58 & 1) * auVar136._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar134._0_4_);
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        fVar116 = (float)((uint)bVar61 * auVar136._4_4_ | (uint)!bVar61 * auVar134._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        fVar118 = (float)((uint)bVar61 * auVar136._8_4_ | (uint)!bVar61 * auVar134._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        fVar121 = (float)((uint)bVar61 * auVar136._12_4_ | (uint)!bVar61 * auVar134._12_4_);
        auVar90 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar118,CONCAT44(fVar116,fVar67))));
        auVar85._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar135._0_4_
                    );
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar85._4_4_ = (float)((uint)bVar61 * auVar91._4_4_ | (uint)!bVar61 * auVar135._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar85._8_4_ = (float)((uint)bVar61 * auVar91._8_4_ | (uint)!bVar61 * auVar135._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar85._12_4_ = (float)((uint)bVar61 * auVar91._12_4_ | (uint)!bVar61 * auVar135._12_4_);
        fVar130 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar91._16_4_);
        auVar85._16_4_ = fVar130;
        fVar142 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar91._20_4_);
        auVar85._20_4_ = fVar142;
        fVar131 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar91._24_4_);
        auVar85._24_4_ = fVar131;
        iVar1 = (uint)(byte)(uVar59 >> 7) * auVar91._28_4_;
        auVar85._28_4_ = iVar1;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar77);
        auVar97._0_4_ =
             (uint)(bVar58 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar69._0_4_;
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar97._4_4_ = (uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar69._4_4_;
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar97._8_4_ = (uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar69._8_4_;
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar97._12_4_ = (uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar69._12_4_;
        auVar97._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * auVar92._16_4_;
        auVar97._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * auVar92._20_4_;
        auVar97._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * auVar92._24_4_;
        auVar97._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar125),ZEXT1632(auVar73));
        auVar98._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar136._0_4_
                    );
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar136._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar136._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar136._12_4_);
        fVar161 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar92._16_4_);
        auVar98._16_4_ = fVar161;
        fVar165 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar92._20_4_);
        auVar98._20_4_ = fVar165;
        fVar132 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar92._24_4_);
        auVar98._24_4_ = fVar132;
        auVar98._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar71));
        auVar99._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar91._0_4_)
        ;
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar91._4_4_);
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar91._8_4_);
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar91._12_4_);
        bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar61 * auVar92._16_4_ | (uint)!bVar61 * auVar91._16_4_);
        bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar61 * auVar92._20_4_ | (uint)!bVar61 * auVar91._20_4_);
        bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar61 * auVar92._24_4_ | (uint)!bVar61 * auVar91._24_4_);
        bVar61 = SUB81(uVar59 >> 7,0);
        auVar99._28_4_ = (uint)bVar61 * auVar92._28_4_ | (uint)!bVar61 * auVar91._28_4_;
        auVar100._0_4_ =
             (uint)(bVar58 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar77._0_4_;
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar100._4_4_ = (uint)bVar61 * (int)auVar75._4_4_ | (uint)!bVar61 * auVar77._4_4_;
        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar100._8_4_ = (uint)bVar61 * (int)auVar75._8_4_ | (uint)!bVar61 * auVar77._8_4_;
        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar100._12_4_ = (uint)bVar61 * (int)auVar75._12_4_ | (uint)!bVar61 * auVar77._12_4_;
        auVar100._16_4_ = (uint)!(bool)((byte)(uVar59 >> 4) & 1) * auVar77._16_4_;
        auVar100._20_4_ = (uint)!(bool)((byte)(uVar59 >> 5) & 1) * auVar77._20_4_;
        auVar100._24_4_ = (uint)!(bool)((byte)(uVar59 >> 6) & 1) * auVar77._24_4_;
        auVar100._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar77._28_4_;
        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar101._0_4_ =
             (uint)(bVar58 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar71._0_4_;
        bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar71._4_4_;
        bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar71._8_4_;
        bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar71._12_4_;
        auVar101._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * auVar94._16_4_;
        auVar101._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * auVar94._20_4_;
        auVar101._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar59 >> 7) * auVar94._28_4_;
        auVar101._28_4_ = iVar2;
        auVar80 = vsubps_avx512vl(auVar100,auVar79);
        auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar125._12_4_ |
                                                (uint)!bVar15 * auVar73._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar125._8_4_ |
                                                         (uint)!bVar13 * auVar73._8_4_,
                                                         CONCAT44((uint)bVar61 * (int)auVar125._4_4_
                                                                  | (uint)!bVar61 * auVar73._4_4_,
                                                                  (uint)(bVar58 & 1) *
                                                                  (int)auVar125._0_4_ |
                                                                  (uint)!(bool)(bVar58 & 1) *
                                                                  auVar73._0_4_)))),auVar90);
        auVar92 = vsubps_avx(auVar101,auVar85);
        auVar91 = vsubps_avx(auVar79,auVar97);
        auVar77 = vsubps_avx(auVar90,auVar98);
        auVar78 = vsubps_avx(auVar85,auVar99);
        auVar81._4_4_ = auVar92._4_4_ * fVar115;
        auVar81._0_4_ = auVar92._0_4_ * fVar66;
        auVar81._8_4_ = auVar92._8_4_ * fVar117;
        auVar81._12_4_ = auVar92._12_4_ * fVar120;
        auVar81._16_4_ = auVar92._16_4_ * 0.0;
        auVar81._20_4_ = auVar92._20_4_ * 0.0;
        auVar81._24_4_ = auVar92._24_4_ * 0.0;
        auVar81._28_4_ = iVar2;
        auVar74 = vfmsub231ps_fma(auVar81,auVar85,auVar80);
        auVar82._4_4_ = fVar116 * auVar80._4_4_;
        auVar82._0_4_ = fVar67 * auVar80._0_4_;
        auVar82._8_4_ = fVar118 * auVar80._8_4_;
        auVar82._12_4_ = fVar121 * auVar80._12_4_;
        auVar82._16_4_ = auVar80._16_4_ * 0.0;
        auVar82._20_4_ = auVar80._20_4_ * 0.0;
        auVar82._24_4_ = auVar80._24_4_ * 0.0;
        auVar82._28_4_ = auVar93._28_4_;
        auVar136 = vfmsub231ps_fma(auVar82,auVar79,auVar94);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar136),auVar84,ZEXT1632(auVar74));
        auVar154._0_4_ = auVar94._0_4_ * auVar85._0_4_;
        auVar154._4_4_ = auVar94._4_4_ * auVar85._4_4_;
        auVar154._8_4_ = auVar94._8_4_ * auVar85._8_4_;
        auVar154._12_4_ = auVar94._12_4_ * auVar85._12_4_;
        auVar154._16_4_ = auVar94._16_4_ * fVar130;
        auVar154._20_4_ = auVar94._20_4_ * fVar142;
        auVar154._24_4_ = auVar94._24_4_ * fVar131;
        auVar154._28_4_ = 0;
        auVar74 = vfmsub231ps_fma(auVar154,auVar90,auVar92);
        auVar81 = vfmadd231ps_avx512vl(auVar93,auVar84,ZEXT1632(auVar74));
        auVar93 = vmulps_avx512vl(auVar78,auVar97);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar99);
        auVar83._4_4_ = auVar77._4_4_ * auVar99._4_4_;
        auVar83._0_4_ = auVar77._0_4_ * auVar99._0_4_;
        auVar83._8_4_ = auVar77._8_4_ * auVar99._8_4_;
        auVar83._12_4_ = auVar77._12_4_ * auVar99._12_4_;
        auVar83._16_4_ = auVar77._16_4_ * auVar99._16_4_;
        auVar83._20_4_ = auVar77._20_4_ * auVar99._20_4_;
        auVar83._24_4_ = auVar77._24_4_ * auVar99._24_4_;
        auVar83._28_4_ = auVar99._28_4_;
        auVar74 = vfmsub231ps_fma(auVar83,auVar98,auVar78);
        auVar155._0_4_ = auVar98._0_4_ * auVar91._0_4_;
        auVar155._4_4_ = auVar98._4_4_ * auVar91._4_4_;
        auVar155._8_4_ = auVar98._8_4_ * auVar91._8_4_;
        auVar155._12_4_ = auVar98._12_4_ * auVar91._12_4_;
        auVar155._16_4_ = fVar161 * auVar91._16_4_;
        auVar155._20_4_ = fVar165 * auVar91._20_4_;
        auVar155._24_4_ = fVar132 * auVar91._24_4_;
        auVar155._28_4_ = 0;
        auVar136 = vfmsub231ps_fma(auVar155,auVar77,auVar97);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar136),auVar84,auVar93);
        auVar82 = vfmadd231ps_avx512vl(auVar93,auVar84,ZEXT1632(auVar74));
        auVar93 = vmaxps_avx(auVar81,auVar82);
        uVar133 = vcmpps_avx512vl(auVar93,auVar84,2);
        bVar65 = bVar65 & (byte)uVar133;
        auVar186 = ZEXT3264(local_780);
        auVar187 = ZEXT3264(local_760);
        auVar183 = ZEXT3264(local_8c0);
        auVar129 = ZEXT3264(local_8a0);
        if (bVar65 == 0) {
          bVar61 = false;
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar184 = ZEXT3264(auVar93);
          auVar188 = ZEXT3264(local_840);
          auVar190 = ZEXT3264(local_860);
          auVar191 = ZEXT3264(local_880);
        }
        else {
          uVar124 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar177._4_4_ = uVar124;
          auVar177._0_4_ = uVar124;
          auVar177._8_4_ = uVar124;
          auVar177._12_4_ = uVar124;
          auVar177._16_4_ = uVar124;
          auVar177._20_4_ = uVar124;
          auVar177._24_4_ = uVar124;
          auVar177._28_4_ = uVar124;
          auVar179 = ZEXT3264(auVar177);
          auVar30._4_4_ = auVar78._4_4_ * auVar94._4_4_;
          auVar30._0_4_ = auVar78._0_4_ * auVar94._0_4_;
          auVar30._8_4_ = auVar78._8_4_ * auVar94._8_4_;
          auVar30._12_4_ = auVar78._12_4_ * auVar94._12_4_;
          auVar30._16_4_ = auVar78._16_4_ * auVar94._16_4_;
          auVar30._20_4_ = auVar78._20_4_ * auVar94._20_4_;
          auVar30._24_4_ = auVar78._24_4_ * auVar94._24_4_;
          auVar30._28_4_ = auVar93._28_4_;
          auVar73 = vfmsub231ps_fma(auVar30,auVar77,auVar92);
          auVar31._4_4_ = auVar92._4_4_ * auVar91._4_4_;
          auVar31._0_4_ = auVar92._0_4_ * auVar91._0_4_;
          auVar31._8_4_ = auVar92._8_4_ * auVar91._8_4_;
          auVar31._12_4_ = auVar92._12_4_ * auVar91._12_4_;
          auVar31._16_4_ = auVar92._16_4_ * auVar91._16_4_;
          auVar31._20_4_ = auVar92._20_4_ * auVar91._20_4_;
          auVar31._24_4_ = auVar92._24_4_ * auVar91._24_4_;
          auVar31._28_4_ = auVar92._28_4_;
          auVar136 = vfmsub231ps_fma(auVar31,auVar80,auVar78);
          auVar32._4_4_ = auVar77._4_4_ * auVar80._4_4_;
          auVar32._0_4_ = auVar77._0_4_ * auVar80._0_4_;
          auVar32._8_4_ = auVar77._8_4_ * auVar80._8_4_;
          auVar32._12_4_ = auVar77._12_4_ * auVar80._12_4_;
          auVar32._16_4_ = auVar77._16_4_ * auVar80._16_4_;
          auVar32._20_4_ = auVar77._20_4_ * auVar80._20_4_;
          auVar32._24_4_ = auVar77._24_4_ * auVar80._24_4_;
          auVar32._28_4_ = auVar77._28_4_;
          auVar71 = vfmsub231ps_fma(auVar32,auVar91,auVar94);
          auVar74 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar136),ZEXT1632(auVar71));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar73),auVar84);
          auVar94 = vrcp14ps_avx512vl(auVar93);
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar184 = ZEXT3264(auVar92);
          auVar91 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar92);
          auVar74 = vfmadd132ps_fma(auVar91,auVar94,auVar94);
          auVar33._4_4_ = auVar71._4_4_ * auVar85._4_4_;
          auVar33._0_4_ = auVar71._0_4_ * auVar85._0_4_;
          auVar33._8_4_ = auVar71._8_4_ * auVar85._8_4_;
          auVar33._12_4_ = auVar71._12_4_ * auVar85._12_4_;
          auVar33._16_4_ = fVar130 * 0.0;
          auVar33._20_4_ = fVar142 * 0.0;
          auVar33._24_4_ = fVar131 * 0.0;
          auVar33._28_4_ = iVar1;
          auVar136 = vfmadd231ps_fma(auVar33,auVar90,ZEXT1632(auVar136));
          auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar79,ZEXT1632(auVar73));
          fVar142 = auVar74._0_4_;
          fVar130 = auVar74._4_4_;
          fVar131 = auVar74._8_4_;
          fVar132 = auVar74._12_4_;
          local_620 = ZEXT1632(CONCAT412(auVar136._12_4_ * fVar132,
                                         CONCAT48(auVar136._8_4_ * fVar131,
                                                  CONCAT44(auVar136._4_4_ * fVar130,
                                                           auVar136._0_4_ * fVar142))));
          auVar168._4_4_ = uVar172;
          auVar168._0_4_ = uVar172;
          auVar168._8_4_ = uVar172;
          auVar168._12_4_ = uVar172;
          auVar168._16_4_ = uVar172;
          auVar168._20_4_ = uVar172;
          auVar168._24_4_ = uVar172;
          auVar168._28_4_ = uVar172;
          uVar133 = vcmpps_avx512vl(local_620,auVar177,2);
          uVar23 = vcmpps_avx512vl(auVar168,local_620,2);
          bVar65 = (byte)uVar133 & (byte)uVar23 & bVar65;
          auVar188 = ZEXT3264(local_840);
          auVar190 = ZEXT3264(local_860);
          auVar191 = ZEXT3264(local_880);
          if (bVar65 != 0) {
            uVar133 = vcmpps_avx512vl(auVar93,auVar84,4);
            bVar65 = bVar65 & (byte)uVar133;
            if (bVar65 != 0) {
              fVar161 = auVar81._0_4_ * fVar142;
              fVar165 = auVar81._4_4_ * fVar130;
              auVar34._4_4_ = fVar165;
              auVar34._0_4_ = fVar161;
              fVar66 = auVar81._8_4_ * fVar131;
              auVar34._8_4_ = fVar66;
              fVar67 = auVar81._12_4_ * fVar132;
              auVar34._12_4_ = fVar67;
              fVar115 = auVar81._16_4_ * 0.0;
              auVar34._16_4_ = fVar115;
              fVar116 = auVar81._20_4_ * 0.0;
              auVar34._20_4_ = fVar116;
              fVar117 = auVar81._24_4_ * 0.0;
              auVar34._24_4_ = fVar117;
              auVar34._28_4_ = auVar93._28_4_;
              auVar94 = vsubps_avx512vl(auVar92,auVar34);
              local_660._0_4_ =
                   (float)((uint)(bVar58 & 1) * (int)fVar161 |
                          (uint)!(bool)(bVar58 & 1) * auVar94._0_4_);
              bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
              local_660._4_4_ = (float)((uint)bVar61 * (int)fVar165 | (uint)!bVar61 * auVar94._4_4_)
              ;
              bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
              local_660._8_4_ = (float)((uint)bVar61 * (int)fVar66 | (uint)!bVar61 * auVar94._8_4_);
              bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
              local_660._12_4_ =
                   (float)((uint)bVar61 * (int)fVar67 | (uint)!bVar61 * auVar94._12_4_);
              bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
              local_660._16_4_ =
                   (float)((uint)bVar61 * (int)fVar115 | (uint)!bVar61 * auVar94._16_4_);
              bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
              local_660._20_4_ =
                   (float)((uint)bVar61 * (int)fVar116 | (uint)!bVar61 * auVar94._20_4_);
              bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
              local_660._24_4_ =
                   (float)((uint)bVar61 * (int)fVar117 | (uint)!bVar61 * auVar94._24_4_);
              bVar61 = SUB81(uVar59 >> 7,0);
              local_660._28_4_ =
                   (float)((uint)bVar61 * auVar93._28_4_ | (uint)!bVar61 * auVar94._28_4_);
              auVar93 = vsubps_avx(ZEXT1632(auVar21),auVar87);
              auVar74 = vfmadd213ps_fma(auVar93,local_660,auVar87);
              uVar124 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar87._4_4_ = uVar124;
              auVar87._0_4_ = uVar124;
              auVar87._8_4_ = uVar124;
              auVar87._12_4_ = uVar124;
              auVar87._16_4_ = uVar124;
              auVar87._20_4_ = uVar124;
              auVar87._24_4_ = uVar124;
              auVar87._28_4_ = uVar124;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                                           CONCAT48(auVar74._8_4_ + auVar74._8_4_,
                                                                    CONCAT44(auVar74._4_4_ +
                                                                             auVar74._4_4_,
                                                                             auVar74._0_4_ +
                                                                             auVar74._0_4_)))),
                                        auVar87);
              uVar133 = vcmpps_avx512vl(local_620,auVar93,6);
              if (((byte)uVar133 & bVar65) != 0) {
                auVar141._0_4_ = auVar82._0_4_ * fVar142;
                auVar141._4_4_ = auVar82._4_4_ * fVar130;
                auVar141._8_4_ = auVar82._8_4_ * fVar131;
                auVar141._12_4_ = auVar82._12_4_ * fVar132;
                auVar141._16_4_ = auVar82._16_4_ * 0.0;
                auVar141._20_4_ = auVar82._20_4_ * 0.0;
                auVar141._24_4_ = auVar82._24_4_ * 0.0;
                auVar141._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar92,auVar141);
                auVar102._0_4_ =
                     (uint)(bVar58 & 1) * (int)auVar141._0_4_ |
                     (uint)!(bool)(bVar58 & 1) * auVar93._0_4_;
                bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
                auVar102._4_4_ = (uint)bVar61 * (int)auVar141._4_4_ | (uint)!bVar61 * auVar93._4_4_;
                bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
                auVar102._8_4_ = (uint)bVar61 * (int)auVar141._8_4_ | (uint)!bVar61 * auVar93._8_4_;
                bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                auVar102._12_4_ =
                     (uint)bVar61 * (int)auVar141._12_4_ | (uint)!bVar61 * auVar93._12_4_;
                bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                auVar102._16_4_ =
                     (uint)bVar61 * (int)auVar141._16_4_ | (uint)!bVar61 * auVar93._16_4_;
                bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
                auVar102._20_4_ =
                     (uint)bVar61 * (int)auVar141._20_4_ | (uint)!bVar61 * auVar93._20_4_;
                bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
                auVar102._24_4_ =
                     (uint)bVar61 * (int)auVar141._24_4_ | (uint)!bVar61 * auVar93._24_4_;
                auVar102._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar93._28_4_;
                auVar27._8_4_ = 0x40000000;
                auVar27._0_8_ = 0x4000000040000000;
                auVar27._12_4_ = 0x40000000;
                auVar27._16_4_ = 0x40000000;
                auVar27._20_4_ = 0x40000000;
                auVar27._24_4_ = 0x40000000;
                auVar27._28_4_ = 0x40000000;
                local_640 = vfmsub132ps_avx512vl(auVar102,auVar92,auVar27);
                local_600 = 0;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar61 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar142 = 1.0 / auVar88._0_4_;
                    local_5a0[0] = fVar142 * (local_660._0_4_ + 0.0);
                    local_5a0[1] = fVar142 * (local_660._4_4_ + 1.0);
                    local_5a0[2] = fVar142 * (local_660._8_4_ + 2.0);
                    local_5a0[3] = fVar142 * (local_660._12_4_ + 3.0);
                    fStack_590 = fVar142 * (local_660._16_4_ + 4.0);
                    fStack_58c = fVar142 * (local_660._20_4_ + 5.0);
                    fStack_588 = fVar142 * (local_660._24_4_ + 6.0);
                    fStack_584 = local_660._28_4_ + 7.0;
                    local_580 = local_640;
                    local_560 = local_620;
                    local_6a0 = 0;
                    uVar60 = (ulong)((byte)uVar133 & bVar65);
                    for (uVar59 = uVar60; (uVar59 & 1) == 0;
                        uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                      local_6a0 = local_6a0 + 1;
                    }
                    auVar184 = vpbroadcastd_avx512f();
                    local_500 = vmovdqa64_avx512f(auVar184);
                    auVar184 = vpbroadcastd_avx512f();
                    local_540 = vmovdqa64_avx512f(auVar184);
                    local_7e0 = auVar177;
                    local_5fc = iVar9;
                    local_5f0 = auVar72;
                    local_5e0 = uVar22;
                    uStack_5d8 = uVar53;
                    local_5d0 = uVar54;
                    uStack_5c8 = uVar55;
                    do {
                      auVar73 = auVar185._0_16_;
                      local_720 = (uint)uVar60;
                      uStack_71c = (uint)(uVar60 >> 0x20);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[local_6a0]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)(local_580 + local_6a0 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_560 + local_6a0 * 4);
                      local_8f0.context = context->user;
                      fVar130 = local_200._0_4_;
                      fVar142 = 1.0 - fVar130;
                      auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(fVar130 * (fVar142 + fVar142))),
                                                 ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
                      auVar136 = local_200._0_16_;
                      auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar136,
                                                ZEXT416(0xc0a00000));
                      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130 * 3.0)),
                                                ZEXT416((uint)(fVar130 + fVar130)),auVar70);
                      auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar136,
                                                ZEXT416(0x40000000));
                      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * -3.0)),
                                                ZEXT416((uint)(fVar142 + fVar142)),auVar70);
                      auVar136 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),auVar136,
                                                 ZEXT416((uint)(fVar142 * -2.0)));
                      fVar142 = auVar21._0_4_ * 0.5;
                      fVar130 = auVar74._0_4_ * 0.5;
                      fVar131 = auVar70._0_4_ * 0.5;
                      fVar132 = auVar136._0_4_ * 0.5;
                      auVar147._0_4_ = fVar132 * local_800;
                      auVar147._4_4_ = fVar132 * fStack_7fc;
                      auVar147._8_4_ = fVar132 * fStack_7f8;
                      auVar147._12_4_ = fVar132 * fStack_7f4;
                      auVar159._4_4_ = fVar131;
                      auVar159._0_4_ = fVar131;
                      auVar159._8_4_ = fVar131;
                      auVar159._12_4_ = fVar131;
                      auVar70 = vfmadd132ps_fma(auVar159,auVar147,auVar137);
                      auVar148._4_4_ = fVar130;
                      auVar148._0_4_ = fVar130;
                      auVar148._8_4_ = fVar130;
                      auVar148._12_4_ = fVar130;
                      auVar70 = vfmadd132ps_fma(auVar148,auVar70,auVar18);
                      auVar127._4_4_ = fVar142;
                      auVar127._0_4_ = fVar142;
                      auVar127._8_4_ = fVar142;
                      auVar127._12_4_ = fVar142;
                      auVar70 = vfmadd213ps_fma(auVar127,auVar72,auVar70);
                      auVar184 = vbroadcastss_avx512f(auVar70);
                      auVar113 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar113,ZEXT1664(auVar70));
                      auVar113 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar113,ZEXT1664(auVar70));
                      local_2c0[0] = (RTCHitN)auVar184[0];
                      local_2c0[1] = (RTCHitN)auVar184[1];
                      local_2c0[2] = (RTCHitN)auVar184[2];
                      local_2c0[3] = (RTCHitN)auVar184[3];
                      local_2c0[4] = (RTCHitN)auVar184[4];
                      local_2c0[5] = (RTCHitN)auVar184[5];
                      local_2c0[6] = (RTCHitN)auVar184[6];
                      local_2c0[7] = (RTCHitN)auVar184[7];
                      local_2c0[8] = (RTCHitN)auVar184[8];
                      local_2c0[9] = (RTCHitN)auVar184[9];
                      local_2c0[10] = (RTCHitN)auVar184[10];
                      local_2c0[0xb] = (RTCHitN)auVar184[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar184[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar184[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar184[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar184[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar184[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar184[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar184[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar184[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar184[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar184[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar184[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar184[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar184[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar184[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar184[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar184[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar184[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar184[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar184[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar184[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar184[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar184[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar184[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar184[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar184[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar184[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar184[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar184[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar184[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar184[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar184[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar184[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar184[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar184[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar184[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar184[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar184[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar184[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar184[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar184[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar184[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar184[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar184[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar184[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar184[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar184[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar184[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar184[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar184[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar184[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar184[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar184[0x3f];
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      uStack_160 = local_540._32_8_;
                      uStack_158 = local_540._40_8_;
                      uStack_150 = local_540._48_8_;
                      uStack_148 = local_540._56_8_;
                      auVar184 = vmovdqa64_avx512f(local_500);
                      local_140 = vmovdqa64_avx512f(auVar184);
                      vpcmpeqd_avx2(auVar184._0_32_,auVar184._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instPrimID[0]));
                      auVar113 = vmovdqa64_avx512f(local_300);
                      local_700 = vmovdqa64_avx512f(auVar113);
                      local_8f0.valid = (int *)local_700;
                      local_8f0.geometryUserPtr = pGVar10->userPtr;
                      local_8f0.hit = local_2c0;
                      local_8f0.N = 0x10;
                      local_8f0.ray = (RTCRayN *)ray;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar10->occlusionFilterN)(&local_8f0);
                        auVar179 = ZEXT3264(local_7e0);
                        auVar192 = ZEXT1664(local_740._0_16_);
                        auVar191 = ZEXT3264(local_880);
                        auVar190 = ZEXT3264(local_860);
                        auVar189 = ZEXT3264(local_7a0);
                        auVar188 = ZEXT3264(local_840);
                        auVar129 = ZEXT3264(local_8a0);
                        auVar183 = ZEXT3264(local_8c0);
                        auVar187 = ZEXT3264(local_760);
                        auVar186 = ZEXT3264(local_780);
                        auVar70 = vxorps_avx512vl(auVar73,auVar73);
                        auVar185 = ZEXT1664(auVar70);
                        auVar113 = vmovdqa64_avx512f(local_700);
                        uVar172 = local_7c0._0_4_;
                      }
                      auVar70 = auVar185._0_16_;
                      uVar133 = vptestmd_avx512f(auVar113,auVar113);
                      if ((short)uVar133 == 0) {
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar184 = ZEXT3264(auVar93);
                        uVar60 = CONCAT44(uStack_71c,local_720);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar93);
                        }
                        else {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar93);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_8f0);
                            auVar179 = ZEXT3264(local_7e0);
                            auVar192 = ZEXT1664(local_740._0_16_);
                            auVar191 = ZEXT3264(local_880);
                            auVar190 = ZEXT3264(local_860);
                            auVar189 = ZEXT3264(local_7a0);
                            auVar188 = ZEXT3264(local_840);
                            auVar129 = ZEXT3264(local_8a0);
                            auVar183 = ZEXT3264(local_8c0);
                            auVar187 = ZEXT3264(local_760);
                            auVar186 = ZEXT3264(local_780);
                            auVar70 = vxorps_avx512vl(auVar70,auVar70);
                            auVar185 = ZEXT1664(auVar70);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar184 = ZEXT3264(auVar93);
                            auVar113 = vmovdqa64_avx512f(local_700);
                            uVar172 = local_7c0._0_4_;
                          }
                        }
                        auVar70 = auVar192._0_16_;
                        uVar59 = vptestmd_avx512f(auVar113,auVar113);
                        auVar114 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar61 = (bool)((byte)uVar59 & 1);
                        auVar113._0_4_ =
                             (uint)bVar61 * auVar114._0_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x200);
                        bVar61 = (bool)((byte)(uVar59 >> 1) & 1);
                        auVar113._4_4_ =
                             (uint)bVar61 * auVar114._4_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x204);
                        bVar61 = (bool)((byte)(uVar59 >> 2) & 1);
                        auVar113._8_4_ =
                             (uint)bVar61 * auVar114._8_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x208);
                        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                        auVar113._12_4_ =
                             (uint)bVar61 * auVar114._12_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x20c);
                        bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                        auVar113._16_4_ =
                             (uint)bVar61 * auVar114._16_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x210);
                        bVar61 = (bool)((byte)(uVar59 >> 5) & 1);
                        auVar113._20_4_ =
                             (uint)bVar61 * auVar114._20_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x214);
                        bVar61 = (bool)((byte)(uVar59 >> 6) & 1);
                        auVar113._24_4_ =
                             (uint)bVar61 * auVar114._24_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x218);
                        bVar61 = (bool)((byte)(uVar59 >> 7) & 1);
                        auVar113._28_4_ =
                             (uint)bVar61 * auVar114._28_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x21c);
                        bVar61 = (bool)((byte)(uVar59 >> 8) & 1);
                        auVar113._32_4_ =
                             (uint)bVar61 * auVar114._32_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x220);
                        bVar61 = (bool)((byte)(uVar59 >> 9) & 1);
                        auVar113._36_4_ =
                             (uint)bVar61 * auVar114._36_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x224);
                        bVar61 = (bool)((byte)(uVar59 >> 10) & 1);
                        auVar113._40_4_ =
                             (uint)bVar61 * auVar114._40_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x228);
                        bVar61 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        auVar113._44_4_ =
                             (uint)bVar61 * auVar114._44_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x22c);
                        bVar61 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        auVar113._48_4_ =
                             (uint)bVar61 * auVar114._48_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x230);
                        bVar61 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        auVar113._52_4_ =
                             (uint)bVar61 * auVar114._52_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x234);
                        bVar61 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        auVar113._56_4_ =
                             (uint)bVar61 * auVar114._56_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x238);
                        bVar61 = SUB81(uVar59 >> 0xf,0);
                        auVar113._60_4_ =
                             (uint)bVar61 * auVar114._60_4_ |
                             (uint)!bVar61 * *(int *)(local_8f0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_8f0.ray + 0x200) = auVar113;
                        uVar60 = CONCAT44(uStack_71c,local_720);
                        if ((short)uVar59 != 0) {
                          bVar61 = true;
                          break;
                        }
                      }
                      auVar70 = auVar192._0_16_;
                      *(int *)(ray + k * 4 + 0x200) = auVar179._0_4_;
                      uVar59 = local_6a0 & 0x3f;
                      bVar61 = false;
                      local_6a0 = 0;
                      uVar60 = uVar60 ^ 1L << uVar59;
                      for (uVar59 = uVar60; (uVar59 & 1) == 0;
                          uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                        local_6a0 = local_6a0 + 1;
                      }
                    } while (uVar60 != 0);
                  }
                  goto LAB_01adb8ec;
                }
              }
            }
          }
          bVar61 = false;
        }
      }
LAB_01adb8ec:
      if (8 < iVar9) {
        local_740 = vpbroadcastd_avx512vl();
        local_7c0 = vbroadcastss_avx512vl(auVar70);
        fStack_698 = 1.0 / (float)local_480._0_4_;
        auVar192 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar192);
        auVar192 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar192);
        lVar62 = 8;
        local_8a0 = auVar129._0_32_;
        local_720 = uVar172;
        uStack_71c = uVar172;
        uStack_718 = uVar172;
        uStack_714 = uVar172;
        uStack_710 = uVar172;
        uStack_70c = uVar172;
        uStack_708 = uVar172;
        uStack_704 = uVar172;
        fStack_694 = fStack_698;
        fStack_690 = fStack_698;
        fStack_68c = fStack_698;
        fStack_688 = fStack_698;
        fStack_684 = fStack_698;
        local_6a0._0_4_ = fStack_698;
        local_6a0._4_4_ = fStack_698;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar77 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar77,local_740,1);
          auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 * 4 + lVar24);
          auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b37f0 + lVar62 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21b3c74 + lVar62 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b40f8 + lVar62 * 4);
          local_860 = auVar190._0_32_;
          auVar78 = vmulps_avx512vl(local_860,auVar91);
          local_880 = auVar191._0_32_;
          auVar79 = vmulps_avx512vl(local_880,auVar91);
          auVar35._4_4_ = auVar91._4_4_ * (float)local_380._4_4_;
          auVar35._0_4_ = auVar91._0_4_ * (float)local_380._0_4_;
          auVar35._8_4_ = auVar91._8_4_ * fStack_378;
          auVar35._12_4_ = auVar91._12_4_ * fStack_374;
          auVar35._16_4_ = auVar91._16_4_ * fStack_370;
          auVar35._20_4_ = auVar91._20_4_ * fStack_36c;
          auVar35._24_4_ = auVar91._24_4_ * fStack_368;
          auVar35._28_4_ = auVar77._28_4_;
          local_840 = auVar188._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar78,auVar92,local_840);
          auVar97 = auVar189._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar79,auVar92,auVar97);
          auVar79 = vfmadd231ps_avx512vl(auVar35,auVar92,local_360);
          auVar95 = auVar183._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar77,auVar94,auVar95);
          auVar89 = auVar129._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar94,auVar89);
          auVar70 = vfmadd231ps_fma(auVar79,auVar94,local_340);
          auVar96 = auVar186._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar77,auVar93,auVar96);
          local_760 = auVar187._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar78,auVar93,local_760);
          auVar77 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 * 4 + lVar24);
          auVar78 = *(undefined1 (*) [32])(lVar24 + 0x21b5c10 + lVar62 * 4);
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar93,local_320);
          auVar79 = *(undefined1 (*) [32])(lVar24 + 0x21b6094 + lVar62 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21b6518 + lVar62 * 4);
          auVar80 = vmulps_avx512vl(local_860,auVar90);
          auVar81 = vmulps_avx512vl(local_880,auVar90);
          auVar36._4_4_ = auVar90._4_4_ * (float)local_380._4_4_;
          auVar36._0_4_ = auVar90._0_4_ * (float)local_380._0_4_;
          auVar36._8_4_ = auVar90._8_4_ * fStack_378;
          auVar36._12_4_ = auVar90._12_4_ * fStack_374;
          auVar36._16_4_ = auVar90._16_4_ * fStack_370;
          auVar36._20_4_ = auVar90._20_4_ * fStack_36c;
          auVar36._24_4_ = auVar90._24_4_ * fStack_368;
          auVar36._28_4_ = uStack_364;
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar79,local_840);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar97);
          auVar84 = vfmadd231ps_avx512vl(auVar36,auVar79,local_360);
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar95);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar89);
          auVar74 = vfmadd231ps_fma(auVar84,auVar78,local_340);
          auVar84 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar96);
          auVar85 = vfmadd231ps_avx512vl(auVar81,auVar77,local_760);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar77,local_320);
          auVar86 = vmaxps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar74));
          auVar80 = vsubps_avx(auVar84,auVar82);
          auVar81 = vsubps_avx(auVar85,auVar83);
          auVar87 = vmulps_avx512vl(auVar83,auVar80);
          auVar88 = vmulps_avx512vl(auVar82,auVar81);
          auVar87 = vsubps_avx512vl(auVar87,auVar88);
          auVar88 = vmulps_avx512vl(auVar81,auVar81);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar80);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          auVar86 = vmulps_avx512vl(auVar86,auVar88);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          uVar133 = vcmpps_avx512vl(auVar87,auVar86,2);
          bVar65 = (byte)uVar23 & (byte)uVar133;
          if (bVar65 == 0) {
            auVar183 = ZEXT3264(auVar95);
            auVar129 = ZEXT3264(auVar89);
          }
          else {
            auVar90 = vmulps_avx512vl(local_820,auVar90);
            auVar79 = vfmadd213ps_avx512vl(auVar79,local_3e0,auVar90);
            auVar78 = vfmadd213ps_avx512vl(auVar78,local_3c0,auVar79);
            auVar77 = vfmadd213ps_avx512vl(auVar77,local_3a0,auVar78);
            auVar91 = vmulps_avx512vl(local_820,auVar91);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_3e0,auVar91);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_3c0,auVar92);
            auVar78 = vfmadd213ps_avx512vl(auVar93,local_3a0,auVar94);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21b457c + lVar62 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b4a00 + lVar62 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21b4e84 + lVar62 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b5308 + lVar62 * 4);
            auVar79 = vmulps_avx512vl(local_860,auVar91);
            auVar90 = vmulps_avx512vl(local_880,auVar91);
            auVar91 = vmulps_avx512vl(local_820,auVar91);
            auVar79 = vfmadd231ps_avx512vl(auVar79,auVar92,local_840);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar97);
            auVar92 = vfmadd231ps_avx512vl(auVar91,local_3e0,auVar92);
            auVar91 = vfmadd231ps_avx512vl(auVar79,auVar94,auVar95);
            auVar79 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar89);
            auVar94 = vfmadd231ps_avx512vl(auVar92,local_3c0,auVar94);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar96);
            auVar79 = vfmadd231ps_avx512vl(auVar79,auVar93,local_760);
            auVar90 = vfmadd231ps_avx512vl(auVar94,local_3a0,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21b699c + lVar62 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b72a4 + lVar62 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21b7728 + lVar62 * 4);
            auVar86 = vmulps_avx512vl(local_860,auVar92);
            auVar87 = vmulps_avx512vl(local_880,auVar92);
            auVar92 = vmulps_avx512vl(local_820,auVar92);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,local_840);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar97);
            auVar92 = vfmadd231ps_avx512vl(auVar92,local_3e0,auVar94);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b6e20 + lVar62 * 4);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,auVar95);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar89);
            auVar94 = vfmadd231ps_avx512vl(auVar92,local_3c0,auVar94);
            auVar92 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar96);
            auVar86 = vfmadd231ps_avx512vl(auVar87,auVar93,local_760);
            auVar94 = vfmadd231ps_avx512vl(auVar94,local_3a0,auVar93);
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar91,auVar87);
            vandps_avx512vl(auVar79,auVar87);
            auVar93 = vmaxps_avx(auVar87,auVar87);
            vandps_avx512vl(auVar90,auVar87);
            auVar93 = vmaxps_avx(auVar93,auVar87);
            uVar59 = vcmpps_avx512vl(auVar93,local_7c0,1);
            bVar12 = (bool)((byte)uVar59 & 1);
            auVar103._0_4_ = (float)((uint)bVar12 * auVar80._0_4_ | (uint)!bVar12 * auVar91._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar103._4_4_ = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar91._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar103._8_4_ = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar91._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar103._12_4_ =
                 (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar91._12_4_);
            bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
            auVar103._16_4_ =
                 (float)((uint)bVar12 * auVar80._16_4_ | (uint)!bVar12 * auVar91._16_4_);
            bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
            auVar103._20_4_ =
                 (float)((uint)bVar12 * auVar80._20_4_ | (uint)!bVar12 * auVar91._20_4_);
            bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
            auVar103._24_4_ =
                 (float)((uint)bVar12 * auVar80._24_4_ | (uint)!bVar12 * auVar91._24_4_);
            bVar12 = SUB81(uVar59 >> 7,0);
            auVar103._28_4_ = (uint)bVar12 * auVar80._28_4_ | (uint)!bVar12 * auVar91._28_4_;
            bVar12 = (bool)((byte)uVar59 & 1);
            auVar104._0_4_ = (float)((uint)bVar12 * auVar81._0_4_ | (uint)!bVar12 * auVar79._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar104._4_4_ = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar79._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar104._8_4_ = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar79._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar104._12_4_ =
                 (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar79._12_4_);
            bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
            auVar104._16_4_ =
                 (float)((uint)bVar12 * auVar81._16_4_ | (uint)!bVar12 * auVar79._16_4_);
            bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
            auVar104._20_4_ =
                 (float)((uint)bVar12 * auVar81._20_4_ | (uint)!bVar12 * auVar79._20_4_);
            bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
            auVar104._24_4_ =
                 (float)((uint)bVar12 * auVar81._24_4_ | (uint)!bVar12 * auVar79._24_4_);
            bVar12 = SUB81(uVar59 >> 7,0);
            auVar104._28_4_ = (uint)bVar12 * auVar81._28_4_ | (uint)!bVar12 * auVar79._28_4_;
            vandps_avx512vl(auVar92,auVar87);
            vandps_avx512vl(auVar86,auVar87);
            auVar93 = vmaxps_avx(auVar104,auVar104);
            vandps_avx512vl(auVar94,auVar87);
            auVar93 = vmaxps_avx(auVar93,auVar104);
            uVar59 = vcmpps_avx512vl(auVar93,local_7c0,1);
            bVar12 = (bool)((byte)uVar59 & 1);
            auVar105._0_4_ = (uint)bVar12 * auVar80._0_4_ | (uint)!bVar12 * auVar92._0_4_;
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar105._4_4_ = (uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar92._4_4_;
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar105._8_4_ = (uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar92._8_4_;
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar105._12_4_ = (uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar92._12_4_;
            bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
            auVar105._16_4_ = (uint)bVar12 * auVar80._16_4_ | (uint)!bVar12 * auVar92._16_4_;
            bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
            auVar105._20_4_ = (uint)bVar12 * auVar80._20_4_ | (uint)!bVar12 * auVar92._20_4_;
            bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
            auVar105._24_4_ = (uint)bVar12 * auVar80._24_4_ | (uint)!bVar12 * auVar92._24_4_;
            bVar12 = SUB81(uVar59 >> 7,0);
            auVar105._28_4_ = (uint)bVar12 * auVar80._28_4_ | (uint)!bVar12 * auVar92._28_4_;
            bVar12 = (bool)((byte)uVar59 & 1);
            auVar106._0_4_ = (float)((uint)bVar12 * auVar81._0_4_ | (uint)!bVar12 * auVar86._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar106._4_4_ = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar86._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar106._8_4_ = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar86._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar106._12_4_ =
                 (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar86._12_4_);
            bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
            auVar106._16_4_ =
                 (float)((uint)bVar12 * auVar81._16_4_ | (uint)!bVar12 * auVar86._16_4_);
            bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
            auVar106._20_4_ =
                 (float)((uint)bVar12 * auVar81._20_4_ | (uint)!bVar12 * auVar86._20_4_);
            bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
            auVar106._24_4_ =
                 (float)((uint)bVar12 * auVar81._24_4_ | (uint)!bVar12 * auVar86._24_4_);
            bVar12 = SUB81(uVar59 >> 7,0);
            auVar106._28_4_ = (uint)bVar12 * auVar81._28_4_ | (uint)!bVar12 * auVar86._28_4_;
            auVar171._8_4_ = 0x80000000;
            auVar171._0_8_ = 0x8000000080000000;
            auVar171._12_4_ = 0x80000000;
            auVar171._16_4_ = 0x80000000;
            auVar171._20_4_ = 0x80000000;
            auVar171._24_4_ = 0x80000000;
            auVar171._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar105,auVar171);
            auVar86 = auVar185._0_32_;
            auVar94 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar86);
            auVar137 = vfmadd231ps_fma(auVar94,auVar104,auVar104);
            auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar137));
            auVar182._8_4_ = 0xbf000000;
            auVar182._0_8_ = 0xbf000000bf000000;
            auVar182._12_4_ = 0xbf000000;
            auVar182._16_4_ = 0xbf000000;
            auVar182._20_4_ = 0xbf000000;
            auVar182._24_4_ = 0xbf000000;
            auVar182._28_4_ = 0xbf000000;
            fVar142 = auVar94._0_4_;
            fVar130 = auVar94._4_4_;
            fVar131 = auVar94._8_4_;
            fVar132 = auVar94._12_4_;
            fVar161 = auVar94._16_4_;
            fVar165 = auVar94._20_4_;
            fVar66 = auVar94._24_4_;
            auVar37._4_4_ = fVar130 * fVar130 * fVar130 * auVar137._4_4_ * -0.5;
            auVar37._0_4_ = fVar142 * fVar142 * fVar142 * auVar137._0_4_ * -0.5;
            auVar37._8_4_ = fVar131 * fVar131 * fVar131 * auVar137._8_4_ * -0.5;
            auVar37._12_4_ = fVar132 * fVar132 * fVar132 * auVar137._12_4_ * -0.5;
            auVar37._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar37._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar37._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
            auVar37._28_4_ = auVar104._28_4_;
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar94 = vfmadd231ps_avx512vl(auVar37,auVar92,auVar94);
            auVar38._4_4_ = auVar104._4_4_ * auVar94._4_4_;
            auVar38._0_4_ = auVar104._0_4_ * auVar94._0_4_;
            auVar38._8_4_ = auVar104._8_4_ * auVar94._8_4_;
            auVar38._12_4_ = auVar104._12_4_ * auVar94._12_4_;
            auVar38._16_4_ = auVar104._16_4_ * auVar94._16_4_;
            auVar38._20_4_ = auVar104._20_4_ * auVar94._20_4_;
            auVar38._24_4_ = auVar104._24_4_ * auVar94._24_4_;
            auVar38._28_4_ = 0;
            auVar39._4_4_ = auVar94._4_4_ * -auVar103._4_4_;
            auVar39._0_4_ = auVar94._0_4_ * -auVar103._0_4_;
            auVar39._8_4_ = auVar94._8_4_ * -auVar103._8_4_;
            auVar39._12_4_ = auVar94._12_4_ * -auVar103._12_4_;
            auVar39._16_4_ = auVar94._16_4_ * -auVar103._16_4_;
            auVar39._20_4_ = auVar94._20_4_ * -auVar103._20_4_;
            auVar39._24_4_ = auVar94._24_4_ * -auVar103._24_4_;
            auVar39._28_4_ = auVar104._28_4_;
            auVar91 = vmulps_avx512vl(auVar94,auVar86);
            auVar94 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar86);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar106,auVar106);
            auVar79 = vrsqrt14ps_avx512vl(auVar94);
            auVar94 = vmulps_avx512vl(auVar94,auVar182);
            fVar142 = auVar79._0_4_;
            fVar130 = auVar79._4_4_;
            fVar131 = auVar79._8_4_;
            fVar132 = auVar79._12_4_;
            fVar161 = auVar79._16_4_;
            fVar165 = auVar79._20_4_;
            fVar66 = auVar79._24_4_;
            auVar40._4_4_ = fVar130 * fVar130 * fVar130 * auVar94._4_4_;
            auVar40._0_4_ = fVar142 * fVar142 * fVar142 * auVar94._0_4_;
            auVar40._8_4_ = fVar131 * fVar131 * fVar131 * auVar94._8_4_;
            auVar40._12_4_ = fVar132 * fVar132 * fVar132 * auVar94._12_4_;
            auVar40._16_4_ = fVar161 * fVar161 * fVar161 * auVar94._16_4_;
            auVar40._20_4_ = fVar165 * fVar165 * fVar165 * auVar94._20_4_;
            auVar40._24_4_ = fVar66 * fVar66 * fVar66 * auVar94._24_4_;
            auVar40._28_4_ = auVar94._28_4_;
            auVar94 = vfmadd231ps_avx512vl(auVar40,auVar92,auVar79);
            auVar41._4_4_ = auVar106._4_4_ * auVar94._4_4_;
            auVar41._0_4_ = auVar106._0_4_ * auVar94._0_4_;
            auVar41._8_4_ = auVar106._8_4_ * auVar94._8_4_;
            auVar41._12_4_ = auVar106._12_4_ * auVar94._12_4_;
            auVar41._16_4_ = auVar106._16_4_ * auVar94._16_4_;
            auVar41._20_4_ = auVar106._20_4_ * auVar94._20_4_;
            auVar41._24_4_ = auVar106._24_4_ * auVar94._24_4_;
            auVar41._28_4_ = auVar79._28_4_;
            auVar42._4_4_ = auVar94._4_4_ * auVar93._4_4_;
            auVar42._0_4_ = auVar94._0_4_ * auVar93._0_4_;
            auVar42._8_4_ = auVar94._8_4_ * auVar93._8_4_;
            auVar42._12_4_ = auVar94._12_4_ * auVar93._12_4_;
            auVar42._16_4_ = auVar94._16_4_ * auVar93._16_4_;
            auVar42._20_4_ = auVar94._20_4_ * auVar93._20_4_;
            auVar42._24_4_ = auVar94._24_4_ * auVar93._24_4_;
            auVar42._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar94,auVar86);
            auVar137 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar70),auVar82);
            auVar94 = ZEXT1632(auVar70);
            auVar18 = vfmadd213ps_fma(auVar39,auVar94,auVar83);
            auVar92 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar78);
            auVar79 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar74),auVar84);
            auVar69 = vfnmadd213ps_fma(auVar38,auVar94,auVar82);
            auVar90 = ZEXT1632(auVar74);
            auVar136 = vfmadd213ps_fma(auVar42,auVar90,auVar85);
            auVar68 = vfnmadd213ps_fma(auVar39,auVar94,auVar83);
            auVar21 = vfmadd213ps_fma(auVar93,auVar90,auVar77);
            auVar83 = ZEXT1632(auVar70);
            auVar126 = vfnmadd231ps_fma(auVar78,auVar83,auVar91);
            auVar75 = vfnmadd213ps_fma(auVar41,auVar90,auVar84);
            auVar125 = vfnmadd213ps_fma(auVar42,auVar90,auVar85);
            auVar134 = vfnmadd231ps_fma(auVar77,ZEXT1632(auVar74),auVar93);
            auVar77 = vsubps_avx512vl(auVar79,ZEXT1632(auVar69));
            auVar93 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar68));
            auVar94 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar126));
            auVar43._4_4_ = auVar93._4_4_ * auVar126._4_4_;
            auVar43._0_4_ = auVar93._0_4_ * auVar126._0_4_;
            auVar43._8_4_ = auVar93._8_4_ * auVar126._8_4_;
            auVar43._12_4_ = auVar93._12_4_ * auVar126._12_4_;
            auVar43._16_4_ = auVar93._16_4_ * 0.0;
            auVar43._20_4_ = auVar93._20_4_ * 0.0;
            auVar43._24_4_ = auVar93._24_4_ * 0.0;
            auVar43._28_4_ = auVar91._28_4_;
            auVar70 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar68),auVar94);
            auVar44._4_4_ = auVar94._4_4_ * auVar69._4_4_;
            auVar44._0_4_ = auVar94._0_4_ * auVar69._0_4_;
            auVar44._8_4_ = auVar94._8_4_ * auVar69._8_4_;
            auVar44._12_4_ = auVar94._12_4_ * auVar69._12_4_;
            auVar44._16_4_ = auVar94._16_4_ * 0.0;
            auVar44._20_4_ = auVar94._20_4_ * 0.0;
            auVar44._24_4_ = auVar94._24_4_ * 0.0;
            auVar44._28_4_ = auVar94._28_4_;
            auVar73 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar126),auVar77);
            auVar45._4_4_ = auVar68._4_4_ * auVar77._4_4_;
            auVar45._0_4_ = auVar68._0_4_ * auVar77._0_4_;
            auVar45._8_4_ = auVar68._8_4_ * auVar77._8_4_;
            auVar45._12_4_ = auVar68._12_4_ * auVar77._12_4_;
            auVar45._16_4_ = auVar77._16_4_ * 0.0;
            auVar45._20_4_ = auVar77._20_4_ * 0.0;
            auVar45._24_4_ = auVar77._24_4_ * 0.0;
            auVar45._28_4_ = auVar77._28_4_;
            auVar71 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar69),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar86,ZEXT1632(auVar73));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar70));
            uVar59 = vcmpps_avx512vl(auVar93,auVar86,2);
            bVar58 = (byte)uVar59;
            fVar116 = (float)((uint)(bVar58 & 1) * auVar137._0_4_ |
                             (uint)!(bool)(bVar58 & 1) * auVar75._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            fVar118 = (float)((uint)bVar12 * auVar137._4_4_ | (uint)!bVar12 * auVar75._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            fVar121 = (float)((uint)bVar12 * auVar137._8_4_ | (uint)!bVar12 * auVar75._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            fVar122 = (float)((uint)bVar12 * auVar137._12_4_ | (uint)!bVar12 * auVar75._12_4_);
            auVar90 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar121,CONCAT44(fVar118,fVar116))));
            fVar117 = (float)((uint)(bVar58 & 1) * auVar18._0_4_ |
                             (uint)!(bool)(bVar58 & 1) * auVar125._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            fVar120 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar125._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            fVar119 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar125._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            fVar123 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar125._12_4_);
            auVar80 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar119,CONCAT44(fVar120,fVar117))));
            auVar107._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar134._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar134._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar134._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar134._12_4_);
            fVar131 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar92._16_4_);
            auVar107._16_4_ = fVar131;
            fVar130 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar92._20_4_);
            auVar107._20_4_ = fVar130;
            fVar142 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar92._24_4_);
            auVar107._24_4_ = fVar142;
            iVar1 = (uint)(byte)(uVar59 >> 7) * auVar92._28_4_;
            auVar107._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar69),auVar79);
            auVar108._0_4_ =
                 (uint)(bVar58 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar70._0_4_;
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar108._4_4_ = (uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar70._4_4_;
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar108._8_4_ = (uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar70._8_4_;
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar108._12_4_ = (uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar70._12_4_;
            auVar108._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * auVar93._16_4_;
            auVar108._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * auVar93._20_4_;
            auVar108._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * auVar93._24_4_;
            auVar108._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar136));
            auVar109._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar137._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar137._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar137._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar137._12_4_);
            fVar132 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar93._16_4_);
            auVar109._16_4_ = fVar132;
            fVar161 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar93._20_4_);
            auVar109._20_4_ = fVar161;
            fVar165 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar93._24_4_);
            auVar109._24_4_ = fVar165;
            auVar109._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar126),ZEXT1632(auVar21));
            auVar110._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar18._0_4_);
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar18._4_4_);
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar18._8_4_);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar18._12_4_);
            fVar66 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar93._16_4_);
            auVar110._16_4_ = fVar66;
            fVar67 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar93._20_4_);
            auVar110._20_4_ = fVar67;
            fVar115 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar93._24_4_);
            auVar110._24_4_ = fVar115;
            iVar2 = (uint)(byte)(uVar59 >> 7) * auVar93._28_4_;
            auVar110._28_4_ = iVar2;
            auVar111._0_4_ =
                 (uint)(bVar58 & 1) * (int)auVar69._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar79._0_4_
            ;
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar12 * (int)auVar69._4_4_ | (uint)!bVar12 * auVar79._4_4_;
            bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar12 * (int)auVar69._8_4_ | (uint)!bVar12 * auVar79._8_4_;
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar12 * (int)auVar69._12_4_ | (uint)!bVar12 * auVar79._12_4_;
            auVar111._16_4_ = (uint)!(bool)((byte)(uVar59 >> 4) & 1) * auVar79._16_4_;
            auVar111._20_4_ = (uint)!(bool)((byte)(uVar59 >> 5) & 1) * auVar79._20_4_;
            auVar111._24_4_ = (uint)!(bool)((byte)(uVar59 >> 6) & 1) * auVar79._24_4_;
            auVar111._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar79._28_4_;
            bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar59 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar59 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar59 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar59 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar59 >> 3) & 1);
            auVar79 = vsubps_avx512vl(auVar111,auVar90);
            auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar68._12_4_ |
                                                    (uint)!bVar16 * auVar136._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar68._8_4_ |
                                                             (uint)!bVar15 * auVar136._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar68._4_4_ |
                                                                      (uint)!bVar12 * auVar136._4_4_
                                                                      ,(uint)(bVar58 & 1) *
                                                                       (int)auVar68._0_4_ |
                                                                       (uint)!(bool)(bVar58 & 1) *
                                                                       auVar136._0_4_)))),auVar80);
            auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar126._12_4_ |
                                                    (uint)!bVar17 * auVar21._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar126._8_4_ |
                                                             (uint)!bVar14 * auVar21._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar126._4_4_ |
                                                                      (uint)!bVar13 * auVar21._4_4_,
                                                                      (uint)(bVar58 & 1) *
                                                                      (int)auVar126._0_4_ |
                                                                      (uint)!(bool)(bVar58 & 1) *
                                                                      auVar21._0_4_)))),auVar107);
            auVar91 = vsubps_avx(auVar90,auVar108);
            auVar77 = vsubps_avx(auVar80,auVar109);
            auVar78 = vsubps_avx(auVar107,auVar110);
            auVar46._4_4_ = auVar92._4_4_ * fVar118;
            auVar46._0_4_ = auVar92._0_4_ * fVar116;
            auVar46._8_4_ = auVar92._8_4_ * fVar121;
            auVar46._12_4_ = auVar92._12_4_ * fVar122;
            auVar46._16_4_ = auVar92._16_4_ * 0.0;
            auVar46._20_4_ = auVar92._20_4_ * 0.0;
            auVar46._24_4_ = auVar92._24_4_ * 0.0;
            auVar46._28_4_ = 0;
            auVar70 = vfmsub231ps_fma(auVar46,auVar107,auVar79);
            auVar151._0_4_ = fVar117 * auVar79._0_4_;
            auVar151._4_4_ = fVar120 * auVar79._4_4_;
            auVar151._8_4_ = fVar119 * auVar79._8_4_;
            auVar151._12_4_ = fVar123 * auVar79._12_4_;
            auVar151._16_4_ = auVar79._16_4_ * 0.0;
            auVar151._20_4_ = auVar79._20_4_ * 0.0;
            auVar151._24_4_ = auVar79._24_4_ * 0.0;
            auVar151._28_4_ = 0;
            auVar137 = vfmsub231ps_fma(auVar151,auVar90,auVar94);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar137),auVar86,ZEXT1632(auVar70));
            auVar156._0_4_ = auVar94._0_4_ * auVar107._0_4_;
            auVar156._4_4_ = auVar94._4_4_ * auVar107._4_4_;
            auVar156._8_4_ = auVar94._8_4_ * auVar107._8_4_;
            auVar156._12_4_ = auVar94._12_4_ * auVar107._12_4_;
            auVar156._16_4_ = auVar94._16_4_ * fVar131;
            auVar156._20_4_ = auVar94._20_4_ * fVar130;
            auVar156._24_4_ = auVar94._24_4_ * fVar142;
            auVar156._28_4_ = 0;
            auVar70 = vfmsub231ps_fma(auVar156,auVar80,auVar92);
            auVar81 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar70));
            auVar93 = vmulps_avx512vl(auVar78,auVar108);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar110);
            auVar47._4_4_ = auVar77._4_4_ * auVar110._4_4_;
            auVar47._0_4_ = auVar77._0_4_ * auVar110._0_4_;
            auVar47._8_4_ = auVar77._8_4_ * auVar110._8_4_;
            auVar47._12_4_ = auVar77._12_4_ * auVar110._12_4_;
            auVar47._16_4_ = auVar77._16_4_ * fVar66;
            auVar47._20_4_ = auVar77._20_4_ * fVar67;
            auVar47._24_4_ = auVar77._24_4_ * fVar115;
            auVar47._28_4_ = iVar2;
            auVar70 = vfmsub231ps_fma(auVar47,auVar109,auVar78);
            auVar157._0_4_ = auVar109._0_4_ * auVar91._0_4_;
            auVar157._4_4_ = auVar109._4_4_ * auVar91._4_4_;
            auVar157._8_4_ = auVar109._8_4_ * auVar91._8_4_;
            auVar157._12_4_ = auVar109._12_4_ * auVar91._12_4_;
            auVar157._16_4_ = fVar132 * auVar91._16_4_;
            auVar157._20_4_ = fVar161 * auVar91._20_4_;
            auVar157._24_4_ = fVar165 * auVar91._24_4_;
            auVar157._28_4_ = 0;
            auVar137 = vfmsub231ps_fma(auVar157,auVar77,auVar108);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar137),auVar86,auVar93);
            auVar82 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar70));
            auVar93 = vmaxps_avx(auVar81,auVar82);
            uVar133 = vcmpps_avx512vl(auVar93,auVar86,2);
            bVar65 = bVar65 & (byte)uVar133;
            if (bVar65 != 0) {
              uVar124 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar178._4_4_ = uVar124;
              auVar178._0_4_ = uVar124;
              auVar178._8_4_ = uVar124;
              auVar178._12_4_ = uVar124;
              auVar178._16_4_ = uVar124;
              auVar178._20_4_ = uVar124;
              auVar178._24_4_ = uVar124;
              auVar178._28_4_ = uVar124;
              auVar192 = ZEXT3264(auVar178);
              auVar48._4_4_ = auVar78._4_4_ * auVar94._4_4_;
              auVar48._0_4_ = auVar78._0_4_ * auVar94._0_4_;
              auVar48._8_4_ = auVar78._8_4_ * auVar94._8_4_;
              auVar48._12_4_ = auVar78._12_4_ * auVar94._12_4_;
              auVar48._16_4_ = auVar78._16_4_ * auVar94._16_4_;
              auVar48._20_4_ = auVar78._20_4_ * auVar94._20_4_;
              auVar48._24_4_ = auVar78._24_4_ * auVar94._24_4_;
              auVar48._28_4_ = auVar93._28_4_;
              auVar18 = vfmsub231ps_fma(auVar48,auVar77,auVar92);
              auVar49._4_4_ = auVar92._4_4_ * auVar91._4_4_;
              auVar49._0_4_ = auVar92._0_4_ * auVar91._0_4_;
              auVar49._8_4_ = auVar92._8_4_ * auVar91._8_4_;
              auVar49._12_4_ = auVar92._12_4_ * auVar91._12_4_;
              auVar49._16_4_ = auVar92._16_4_ * auVar91._16_4_;
              auVar49._20_4_ = auVar92._20_4_ * auVar91._20_4_;
              auVar49._24_4_ = auVar92._24_4_ * auVar91._24_4_;
              auVar49._28_4_ = auVar92._28_4_;
              auVar137 = vfmsub231ps_fma(auVar49,auVar79,auVar78);
              auVar50._4_4_ = auVar77._4_4_ * auVar79._4_4_;
              auVar50._0_4_ = auVar77._0_4_ * auVar79._0_4_;
              auVar50._8_4_ = auVar77._8_4_ * auVar79._8_4_;
              auVar50._12_4_ = auVar77._12_4_ * auVar79._12_4_;
              auVar50._16_4_ = auVar77._16_4_ * auVar79._16_4_;
              auVar50._20_4_ = auVar77._20_4_ * auVar79._20_4_;
              auVar50._24_4_ = auVar77._24_4_ * auVar79._24_4_;
              auVar50._28_4_ = auVar77._28_4_;
              auVar136 = vfmsub231ps_fma(auVar50,auVar91,auVar94);
              auVar70 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar137),ZEXT1632(auVar136));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar18),auVar86);
              auVar94 = vrcp14ps_avx512vl(auVar93);
              auVar91 = auVar184._0_32_;
              auVar92 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar91);
              auVar70 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
              auVar51._4_4_ = auVar136._4_4_ * auVar107._4_4_;
              auVar51._0_4_ = auVar136._0_4_ * auVar107._0_4_;
              auVar51._8_4_ = auVar136._8_4_ * auVar107._8_4_;
              auVar51._12_4_ = auVar136._12_4_ * auVar107._12_4_;
              auVar51._16_4_ = fVar131 * 0.0;
              auVar51._20_4_ = fVar130 * 0.0;
              auVar51._24_4_ = fVar142 * 0.0;
              auVar51._28_4_ = iVar1;
              auVar137 = vfmadd231ps_fma(auVar51,auVar80,ZEXT1632(auVar137));
              auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar90,ZEXT1632(auVar18));
              fVar142 = auVar70._0_4_;
              fVar130 = auVar70._4_4_;
              fVar131 = auVar70._8_4_;
              fVar132 = auVar70._12_4_;
              local_620 = ZEXT1632(CONCAT412(auVar137._12_4_ * fVar132,
                                             CONCAT48(auVar137._8_4_ * fVar131,
                                                      CONCAT44(auVar137._4_4_ * fVar130,
                                                               auVar137._0_4_ * fVar142))));
              uVar133 = vcmpps_avx512vl(local_620,auVar178,2);
              auVar57._4_4_ = uStack_71c;
              auVar57._0_4_ = local_720;
              auVar57._8_4_ = uStack_718;
              auVar57._12_4_ = uStack_714;
              auVar57._16_4_ = uStack_710;
              auVar57._20_4_ = uStack_70c;
              auVar57._24_4_ = uStack_708;
              auVar57._28_4_ = uStack_704;
              uVar23 = vcmpps_avx512vl(local_620,auVar57,0xd);
              bVar65 = (byte)uVar133 & (byte)uVar23 & bVar65;
              if (bVar65 != 0) {
                uVar133 = vcmpps_avx512vl(auVar93,auVar86,4);
                bVar65 = bVar65 & (byte)uVar133;
                auVar183 = ZEXT3264(local_8c0);
                auVar129 = ZEXT3264(local_8a0);
                if (bVar65 != 0) {
                  fVar161 = auVar81._0_4_ * fVar142;
                  fVar165 = auVar81._4_4_ * fVar130;
                  auVar52._4_4_ = fVar165;
                  auVar52._0_4_ = fVar161;
                  fVar66 = auVar81._8_4_ * fVar131;
                  auVar52._8_4_ = fVar66;
                  fVar67 = auVar81._12_4_ * fVar132;
                  auVar52._12_4_ = fVar67;
                  fVar115 = auVar81._16_4_ * 0.0;
                  auVar52._16_4_ = fVar115;
                  fVar116 = auVar81._20_4_ * 0.0;
                  auVar52._20_4_ = fVar116;
                  fVar117 = auVar81._24_4_ * 0.0;
                  auVar52._24_4_ = fVar117;
                  auVar52._28_4_ = auVar93._28_4_;
                  auVar94 = vsubps_avx512vl(auVar91,auVar52);
                  local_660._0_4_ =
                       (float)((uint)(bVar58 & 1) * (int)fVar161 |
                              (uint)!(bool)(bVar58 & 1) * auVar94._0_4_);
                  bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
                  local_660._4_4_ =
                       (float)((uint)bVar12 * (int)fVar165 | (uint)!bVar12 * auVar94._4_4_);
                  bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                  local_660._8_4_ =
                       (float)((uint)bVar12 * (int)fVar66 | (uint)!bVar12 * auVar94._8_4_);
                  bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
                  local_660._12_4_ =
                       (float)((uint)bVar12 * (int)fVar67 | (uint)!bVar12 * auVar94._12_4_);
                  bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
                  local_660._16_4_ =
                       (float)((uint)bVar12 * (int)fVar115 | (uint)!bVar12 * auVar94._16_4_);
                  bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                  local_660._20_4_ =
                       (float)((uint)bVar12 * (int)fVar116 | (uint)!bVar12 * auVar94._20_4_);
                  bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
                  local_660._24_4_ =
                       (float)((uint)bVar12 * (int)fVar117 | (uint)!bVar12 * auVar94._24_4_);
                  bVar12 = SUB81(uVar59 >> 7,0);
                  local_660._28_4_ =
                       (float)((uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar94._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar74),auVar83);
                  auVar70 = vfmadd213ps_fma(auVar93,local_660,auVar83);
                  uVar124 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar28._4_4_ = uVar124;
                  auVar28._0_4_ = uVar124;
                  auVar28._8_4_ = uVar124;
                  auVar28._12_4_ = uVar124;
                  auVar28._16_4_ = uVar124;
                  auVar28._20_4_ = uVar124;
                  auVar28._24_4_ = uVar124;
                  auVar28._28_4_ = uVar124;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar70._12_4_ + auVar70._12_4_,
                                                               CONCAT48(auVar70._8_4_ +
                                                                        auVar70._8_4_,
                                                                        CONCAT44(auVar70._4_4_ +
                                                                                 auVar70._4_4_,
                                                                                 auVar70._0_4_ +
                                                                                 auVar70._0_4_)))),
                                            auVar28);
                  uVar133 = vcmpps_avx512vl(local_620,auVar93,6);
                  if (((byte)uVar133 & bVar65) != 0) {
                    auVar138._0_4_ = auVar82._0_4_ * fVar142;
                    auVar138._4_4_ = auVar82._4_4_ * fVar130;
                    auVar138._8_4_ = auVar82._8_4_ * fVar131;
                    auVar138._12_4_ = auVar82._12_4_ * fVar132;
                    auVar138._16_4_ = auVar82._16_4_ * 0.0;
                    auVar138._20_4_ = auVar82._20_4_ * 0.0;
                    auVar138._24_4_ = auVar82._24_4_ * 0.0;
                    auVar138._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar91,auVar138);
                    auVar112._0_4_ =
                         (uint)(bVar58 & 1) * (int)auVar138._0_4_ |
                         (uint)!(bool)(bVar58 & 1) * auVar93._0_4_;
                    bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
                    auVar112._4_4_ =
                         (uint)bVar12 * (int)auVar138._4_4_ | (uint)!bVar12 * auVar93._4_4_;
                    bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                    auVar112._8_4_ =
                         (uint)bVar12 * (int)auVar138._8_4_ | (uint)!bVar12 * auVar93._8_4_;
                    bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
                    auVar112._12_4_ =
                         (uint)bVar12 * (int)auVar138._12_4_ | (uint)!bVar12 * auVar93._12_4_;
                    bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
                    auVar112._16_4_ =
                         (uint)bVar12 * (int)auVar138._16_4_ | (uint)!bVar12 * auVar93._16_4_;
                    bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                    auVar112._20_4_ =
                         (uint)bVar12 * (int)auVar138._20_4_ | (uint)!bVar12 * auVar93._20_4_;
                    bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
                    auVar112._24_4_ =
                         (uint)bVar12 * (int)auVar138._24_4_ | (uint)!bVar12 * auVar93._24_4_;
                    auVar112._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar93._28_4_;
                    auVar29._8_4_ = 0x40000000;
                    auVar29._0_8_ = 0x4000000040000000;
                    auVar29._12_4_ = 0x40000000;
                    auVar29._16_4_ = 0x40000000;
                    auVar29._20_4_ = 0x40000000;
                    auVar29._24_4_ = 0x40000000;
                    auVar29._28_4_ = 0x40000000;
                    local_640 = vfmsub132ps_avx512vl(auVar112,auVar91,auVar29);
                    local_600 = (undefined4)lVar62;
                    pGVar10 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar58 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar58 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar70 = vcvtsi2ss_avx512f(auVar184._0_16_,local_600);
                      fVar142 = auVar70._0_4_;
                      local_5a0[0] = (fVar142 + local_660._0_4_ + 0.0) * (float)local_6a0;
                      local_5a0[1] = (fVar142 + local_660._4_4_ + 1.0) * local_6a0._4_4_;
                      local_5a0[2] = (fVar142 + local_660._8_4_ + 2.0) * fStack_698;
                      local_5a0[3] = (fVar142 + local_660._12_4_ + 3.0) * fStack_694;
                      fStack_590 = (fVar142 + local_660._16_4_ + 4.0) * fStack_690;
                      fStack_58c = (fVar142 + local_660._20_4_ + 5.0) * fStack_68c;
                      fStack_588 = (fVar142 + local_660._24_4_ + 6.0) * fStack_688;
                      fStack_584 = fVar142 + local_660._28_4_ + 7.0;
                      local_580 = local_640;
                      local_560 = local_620;
                      uVar59 = CONCAT71(0,(byte)uVar133 & bVar65);
                      local_7e0._0_8_ = uVar59;
                      lVar25 = 0;
                      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_500._0_8_ = lVar25;
                      local_4a0 = auVar178;
                      local_540._0_8_ = pGVar10;
                      local_5fc = iVar9;
                      local_5f0 = auVar72;
                      local_5e0 = uVar22;
                      uStack_5d8 = uVar53;
                      local_5d0 = uVar54;
                      uStack_5c8 = uVar55;
                      do {
                        auVar136 = auVar185._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[local_500._0_8_]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_580 + local_500._0_8_ * 4)));
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_560 + local_500._0_8_ * 4);
                        local_8f0.context = context->user;
                        fVar130 = local_200._0_4_;
                        fVar142 = 1.0 - fVar130;
                        auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar130 * (fVar142 + fVar142))),
                                                   ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
                        auVar137 = local_200._0_16_;
                        auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar137,
                                                  ZEXT416(0xc0a00000));
                        auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130 * 3.0)),
                                                  ZEXT416((uint)(fVar130 + fVar130)),auVar70);
                        auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar137,
                                                  ZEXT416(0x40000000));
                        auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * -3.0)),
                                                  ZEXT416((uint)(fVar142 + fVar142)),auVar70);
                        auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),auVar137,
                                                   ZEXT416((uint)(fVar142 * -2.0)));
                        fVar142 = auVar18._0_4_ * 0.5;
                        fVar130 = auVar74._0_4_ * 0.5;
                        fVar131 = auVar70._0_4_ * 0.5;
                        fVar132 = auVar137._0_4_ * 0.5;
                        auVar149._0_4_ = fVar132 * local_800;
                        auVar149._4_4_ = fVar132 * fStack_7fc;
                        auVar149._8_4_ = fVar132 * fStack_7f8;
                        auVar149._12_4_ = fVar132 * fStack_7f4;
                        auVar160._4_4_ = fVar131;
                        auVar160._0_4_ = fVar131;
                        auVar160._8_4_ = fVar131;
                        auVar160._12_4_ = fVar131;
                        auVar70 = vfmadd132ps_fma(auVar160,auVar149,auVar19);
                        auVar150._4_4_ = fVar130;
                        auVar150._0_4_ = fVar130;
                        auVar150._8_4_ = fVar130;
                        auVar150._12_4_ = fVar130;
                        auVar70 = vfmadd132ps_fma(auVar150,auVar70,auVar20);
                        auVar128._4_4_ = fVar142;
                        auVar128._0_4_ = fVar142;
                        auVar128._8_4_ = fVar142;
                        auVar128._12_4_ = fVar142;
                        auVar70 = vfmadd213ps_fma(auVar128,auVar72,auVar70);
                        auVar190 = vbroadcastss_avx512f(auVar70);
                        auVar191 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar191,ZEXT1664(auVar70));
                        auVar191 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar191,ZEXT1664(auVar70));
                        local_2c0[0] = (RTCHitN)auVar190[0];
                        local_2c0[1] = (RTCHitN)auVar190[1];
                        local_2c0[2] = (RTCHitN)auVar190[2];
                        local_2c0[3] = (RTCHitN)auVar190[3];
                        local_2c0[4] = (RTCHitN)auVar190[4];
                        local_2c0[5] = (RTCHitN)auVar190[5];
                        local_2c0[6] = (RTCHitN)auVar190[6];
                        local_2c0[7] = (RTCHitN)auVar190[7];
                        local_2c0[8] = (RTCHitN)auVar190[8];
                        local_2c0[9] = (RTCHitN)auVar190[9];
                        local_2c0[10] = (RTCHitN)auVar190[10];
                        local_2c0[0xb] = (RTCHitN)auVar190[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar190[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar190[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar190[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar190[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar190[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar190[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar190[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar190[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar190[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar190[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar190[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar190[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar190[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar190[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar190[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar190[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar190[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar190[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar190[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar190[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar190[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar190[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar190[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar190[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar190[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar190[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar190[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar190[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar190[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar190[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar190[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar190[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar190[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar190[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar190[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar190[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar190[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar190[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar190[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar190[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar190[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar190[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar190[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar190[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar190[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar190[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar190[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar190[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar190[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar190[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar190[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar190[0x3f];
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar190 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar190);
                        vpcmpeqd_avx2(auVar190._0_32_,auVar190._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instPrimID[0]))
                        ;
                        auVar190 = vmovdqa64_avx512f(local_300);
                        local_700 = vmovdqa64_avx512f(auVar190);
                        local_8f0.valid = (int *)local_700;
                        local_8f0.geometryUserPtr = *(void **)(local_540._0_8_ + 0x18);
                        local_8f0.hit = local_2c0;
                        local_8f0.N = 0x10;
                        local_8f0.ray = (RTCRayN *)ray;
                        if (*(code **)(local_540._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_540._0_8_ + 0x48))(&local_8f0);
                          auVar192 = ZEXT3264(local_4a0);
                          auVar189 = ZEXT3264(local_7a0);
                          auVar129 = ZEXT3264(local_8a0);
                          auVar183 = ZEXT3264(local_8c0);
                          auVar187 = ZEXT3264(local_760);
                          auVar186 = ZEXT3264(local_780);
                          auVar70 = vxorps_avx512vl(auVar136,auVar136);
                          auVar185 = ZEXT1664(auVar70);
                          auVar190 = vmovdqa64_avx512f(local_700);
                        }
                        auVar70 = auVar185._0_16_;
                        uVar133 = vptestmd_avx512f(auVar190,auVar190);
                        if ((short)uVar133 == 0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar93);
                          auVar188 = ZEXT3264(local_840);
                          auVar190 = ZEXT3264(local_860);
                          auVar191 = ZEXT3264(local_880);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_540._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var11)(&local_8f0);
                            auVar192 = ZEXT3264(local_4a0);
                            auVar189 = ZEXT3264(local_7a0);
                            auVar129 = ZEXT3264(local_8a0);
                            auVar183 = ZEXT3264(local_8c0);
                            auVar187 = ZEXT3264(local_760);
                            auVar186 = ZEXT3264(local_780);
                            auVar70 = vxorps_avx512vl(auVar70,auVar70);
                            auVar185 = ZEXT1664(auVar70);
                            auVar190 = vmovdqa64_avx512f(local_700);
                          }
                          uVar59 = vptestmd_avx512f(auVar190,auVar190);
                          auVar191 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar59 & 1);
                          auVar190._0_4_ =
                               (uint)bVar12 * auVar191._0_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x200);
                          bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
                          auVar190._4_4_ =
                               (uint)bVar12 * auVar191._4_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x204);
                          bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                          auVar190._8_4_ =
                               (uint)bVar12 * auVar191._8_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x208);
                          bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
                          auVar190._12_4_ =
                               (uint)bVar12 * auVar191._12_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x20c);
                          bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
                          auVar190._16_4_ =
                               (uint)bVar12 * auVar191._16_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x210);
                          bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                          auVar190._20_4_ =
                               (uint)bVar12 * auVar191._20_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x214);
                          bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
                          auVar190._24_4_ =
                               (uint)bVar12 * auVar191._24_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x218);
                          bVar12 = (bool)((byte)(uVar59 >> 7) & 1);
                          auVar190._28_4_ =
                               (uint)bVar12 * auVar191._28_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x21c);
                          bVar12 = (bool)((byte)(uVar59 >> 8) & 1);
                          auVar190._32_4_ =
                               (uint)bVar12 * auVar191._32_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x220);
                          bVar12 = (bool)((byte)(uVar59 >> 9) & 1);
                          auVar190._36_4_ =
                               (uint)bVar12 * auVar191._36_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x224);
                          bVar12 = (bool)((byte)(uVar59 >> 10) & 1);
                          auVar190._40_4_ =
                               (uint)bVar12 * auVar191._40_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x228);
                          bVar12 = (bool)((byte)(uVar59 >> 0xb) & 1);
                          auVar190._44_4_ =
                               (uint)bVar12 * auVar191._44_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x22c);
                          bVar12 = (bool)((byte)(uVar59 >> 0xc) & 1);
                          auVar190._48_4_ =
                               (uint)bVar12 * auVar191._48_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x230);
                          bVar12 = (bool)((byte)(uVar59 >> 0xd) & 1);
                          auVar190._52_4_ =
                               (uint)bVar12 * auVar191._52_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x234);
                          bVar12 = (bool)((byte)(uVar59 >> 0xe) & 1);
                          auVar190._56_4_ =
                               (uint)bVar12 * auVar191._56_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x238);
                          bVar12 = SUB81(uVar59 >> 0xf,0);
                          auVar190._60_4_ =
                               (uint)bVar12 * auVar191._60_4_ |
                               (uint)!bVar12 * *(int *)(local_8f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_8f0.ray + 0x200) = auVar190;
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar93);
                          auVar188 = ZEXT3264(local_840);
                          auVar190 = ZEXT3264(local_860);
                          auVar191 = ZEXT3264(local_880);
                          if ((short)uVar59 != 0) {
                            bVar58 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar192._0_4_;
                        local_7e0._0_8_ = local_7e0._0_8_ ^ 1L << (local_500._0_8_ & 0x3f);
                        bVar58 = 0;
                        lVar25 = 0;
                        for (uVar59 = local_7e0._0_8_; (uVar59 & 1) == 0;
                            uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        local_500._0_8_ = lVar25;
                      } while (local_7e0._0_8_ != 0);
                    }
                    bVar61 = (bool)(bVar61 | bVar58);
                  }
                }
                goto LAB_01adc4c7;
              }
            }
            auVar183 = ZEXT3264(local_8c0);
            auVar129 = ZEXT3264(local_8a0);
          }
LAB_01adc4c7:
          lVar62 = lVar62 + 8;
        } while ((int)lVar62 < iVar9);
      }
      if (bVar61) {
        return bVar61;
      }
      uVar124 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar26._4_4_ = uVar124;
      auVar26._0_4_ = uVar124;
      auVar26._8_4_ = uVar124;
      auVar26._12_4_ = uVar124;
      uVar22 = vcmpps_avx512vl(local_670,auVar26,2);
      uVar63 = (uint)uVar64 & (uint)uVar22;
      uVar64 = (ulong)uVar63;
    } while (uVar63 != 0);
  }
  return bVar61;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }